

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float fVar1;
  uint uVar2;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  ulong uVar58;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar59;
  byte bVar60;
  ulong uVar61;
  byte bVar62;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 in_R11;
  ulong uVar63;
  bool bVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  ulong uVar67;
  uint uVar68;
  undefined1 auVar81 [16];
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float pp;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar153;
  undefined4 uVar154;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar162 [32];
  undefined1 auVar155 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar172;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar173;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar220 [16];
  undefined1 auVar224 [32];
  undefined1 auVar222 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar234 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [28];
  float fVar243;
  float fVar244;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cd4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  
  uVar58 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vsubps_avx(auVar71,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar197 = fVar1 * auVar76._0_4_;
  fVar138 = fVar1 * auVar75._0_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar71);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar86 = vpmovsxbd_avx2(auVar13);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar69);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar72);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar58 * 0xc + 6);
  auVar91 = vpmovsxbd_avx2(auVar73);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar89 = vpmovsxbd_avx2(auVar80);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar92 = vpmovsxbd_avx2(auVar79);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 0x13 + 6);
  auVar93 = vpmovsxbd_avx2(auVar70);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar95 = vpmovsxbd_avx2(auVar74);
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar102._4_4_ = fVar138;
  auVar102._0_4_ = fVar138;
  auVar102._8_4_ = fVar138;
  auVar102._12_4_ = fVar138;
  auVar102._16_4_ = fVar138;
  auVar102._20_4_ = fVar138;
  auVar102._24_4_ = fVar138;
  auVar102._28_4_ = fVar138;
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar85 = ZEXT1632(CONCAT412(fVar1 * auVar75._12_4_,
                               CONCAT48(fVar1 * auVar75._8_4_,
                                        CONCAT44(fVar1 * auVar75._4_4_,fVar138))));
  auVar84 = vpermps_avx2(auVar104,auVar85);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = vpermps_avx512vl(auVar82,auVar85);
  fVar138 = auVar83._0_4_;
  auVar152._0_4_ = fVar138 * auVar87._0_4_;
  fVar153 = auVar83._4_4_;
  auVar152._4_4_ = fVar153 * auVar87._4_4_;
  fVar166 = auVar83._8_4_;
  auVar152._8_4_ = fVar166 * auVar87._8_4_;
  fVar167 = auVar83._12_4_;
  auVar152._12_4_ = fVar167 * auVar87._12_4_;
  fVar168 = auVar83._16_4_;
  auVar152._16_4_ = fVar168 * auVar87._16_4_;
  fVar170 = auVar83._20_4_;
  auVar152._20_4_ = fVar170 * auVar87._20_4_;
  fVar169 = auVar83._24_4_;
  auVar152._28_36_ = in_ZMM4._28_36_;
  auVar152._24_4_ = fVar169 * auVar87._24_4_;
  auVar85._4_4_ = auVar89._4_4_ * fVar153;
  auVar85._0_4_ = auVar89._0_4_ * fVar138;
  auVar85._8_4_ = auVar89._8_4_ * fVar166;
  auVar85._12_4_ = auVar89._12_4_ * fVar167;
  auVar85._16_4_ = auVar89._16_4_ * fVar168;
  auVar85._20_4_ = auVar89._20_4_ * fVar170;
  auVar85._24_4_ = auVar89._24_4_ * fVar169;
  auVar85._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar94._4_4_ * fVar153;
  auVar95._0_4_ = auVar94._0_4_ * fVar138;
  auVar95._8_4_ = auVar94._8_4_ * fVar166;
  auVar95._12_4_ = auVar94._12_4_ * fVar167;
  auVar95._16_4_ = auVar94._16_4_ * fVar168;
  auVar95._20_4_ = auVar94._20_4_ * fVar170;
  auVar95._24_4_ = auVar94._24_4_ * fVar169;
  auVar95._28_4_ = auVar83._28_4_;
  auVar71 = vfmadd231ps_fma(auVar152._0_32_,auVar84,auVar86);
  auVar13 = vfmadd231ps_fma(auVar85,auVar84,auVar91);
  auVar69 = vfmadd231ps_fma(auVar95,auVar93,auVar84);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar102,auVar88);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,auVar90);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar92,auVar102);
  auVar103._4_4_ = fVar197;
  auVar103._0_4_ = fVar197;
  auVar103._8_4_ = fVar197;
  auVar103._12_4_ = fVar197;
  auVar103._16_4_ = fVar197;
  auVar103._20_4_ = fVar197;
  auVar103._24_4_ = fVar197;
  auVar103._28_4_ = fVar197;
  auVar84 = ZEXT1632(CONCAT412(fVar1 * auVar76._12_4_,
                               CONCAT48(fVar1 * auVar76._8_4_,
                                        CONCAT44(fVar1 * auVar76._4_4_,fVar197))));
  auVar95 = vpermps_avx2(auVar104,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  auVar85 = vmulps_avx512vl(auVar84,auVar87);
  auVar97._0_4_ = auVar84._0_4_ * auVar89._0_4_;
  auVar97._4_4_ = auVar84._4_4_ * auVar89._4_4_;
  auVar97._8_4_ = auVar84._8_4_ * auVar89._8_4_;
  auVar97._12_4_ = auVar84._12_4_ * auVar89._12_4_;
  auVar97._16_4_ = auVar84._16_4_ * auVar89._16_4_;
  auVar97._20_4_ = auVar84._20_4_ * auVar89._20_4_;
  auVar97._24_4_ = auVar84._24_4_ * auVar89._24_4_;
  auVar97._28_4_ = 0;
  auVar89._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar89._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar89._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar89._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar89._16_4_ = auVar84._16_4_ * auVar94._16_4_;
  auVar89._20_4_ = auVar84._20_4_ * auVar94._20_4_;
  auVar89._24_4_ = auVar84._24_4_ * auVar94._24_4_;
  auVar89._28_4_ = auVar87._28_4_;
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar95,auVar86);
  auVar72 = vfmadd231ps_fma(auVar97,auVar95,auVar91);
  auVar73 = vfmadd231ps_fma(auVar89,auVar95,auVar93);
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar103,auVar88);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar103,auVar90);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar103,auVar92);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar88 = vandps_avx(ZEXT1632(auVar71),auVar99);
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar84._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar13),auVar99);
  uVar63 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar82._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar13._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar69),auVar99);
  uVar63 = vcmpps_avx512vl(auVar88,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar88._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar69._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar69._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar69._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar69._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar84);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar84,auVar87,auVar100);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar82);
  auVar13 = vfnmadd213ps_fma(auVar82,auVar87,auVar100);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar88);
  auVar69 = vfnmadd213ps_fma(auVar88,auVar87,auVar100);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar87,auVar87);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx512vl(auVar88,auVar86);
  auVar92._4_4_ = auVar71._4_4_ * auVar88._4_4_;
  auVar92._0_4_ = auVar71._0_4_ * auVar88._0_4_;
  auVar92._8_4_ = auVar71._8_4_ * auVar88._8_4_;
  auVar92._12_4_ = auVar71._12_4_ * auVar88._12_4_;
  auVar92._16_4_ = auVar88._16_4_ * 0.0;
  auVar92._20_4_ = auVar88._20_4_ * 0.0;
  auVar92._24_4_ = auVar88._24_4_ * 0.0;
  auVar92._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx512vl(auVar88,auVar86);
  auVar98._0_4_ = auVar71._0_4_ * auVar88._0_4_;
  auVar98._4_4_ = auVar71._4_4_ * auVar88._4_4_;
  auVar98._8_4_ = auVar71._8_4_ * auVar88._8_4_;
  auVar98._12_4_ = auVar71._12_4_ * auVar88._12_4_;
  auVar98._16_4_ = auVar88._16_4_ * 0.0;
  auVar98._20_4_ = auVar88._20_4_ * 0.0;
  auVar98._24_4_ = auVar88._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0xe + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar72));
  auVar89 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar93._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar93._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar93._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar93._16_4_ = auVar88._16_4_ * 0.0;
  auVar93._20_4_ = auVar88._20_4_ * 0.0;
  auVar93._24_4_ = auVar88._24_4_ * 0.0;
  auVar93._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar86);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar72));
  auVar96._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar96._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar96._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar96._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar96._16_4_ = auVar88._16_4_ * 0.0;
  auVar96._20_4_ = auVar88._20_4_ * 0.0;
  auVar96._24_4_ = auVar88._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x15 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar73));
  auVar94._4_4_ = auVar88._4_4_ * auVar69._4_4_;
  auVar94._0_4_ = auVar88._0_4_ * auVar69._0_4_;
  auVar94._8_4_ = auVar88._8_4_ * auVar69._8_4_;
  auVar94._12_4_ = auVar88._12_4_ * auVar69._12_4_;
  auVar94._16_4_ = auVar88._16_4_ * 0.0;
  auVar94._20_4_ = auVar88._20_4_ * 0.0;
  auVar94._24_4_ = auVar88._24_4_ * 0.0;
  auVar94._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar73));
  auVar83._0_4_ = auVar69._0_4_ * auVar88._0_4_;
  auVar83._4_4_ = auVar69._4_4_ * auVar88._4_4_;
  auVar83._8_4_ = auVar69._8_4_ * auVar88._8_4_;
  auVar83._12_4_ = auVar69._12_4_ * auVar88._12_4_;
  auVar83._16_4_ = auVar88._16_4_ * 0.0;
  auVar83._20_4_ = auVar88._20_4_ * 0.0;
  auVar83._24_4_ = auVar88._24_4_ * 0.0;
  auVar83._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar92,auVar98);
  auVar86 = vpminsd_avx2(auVar93,auVar96);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86 = vpminsd_avx2(auVar94,auVar83);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar87._4_4_ = uVar154;
  auVar87._0_4_ = uVar154;
  auVar87._8_4_ = uVar154;
  auVar87._12_4_ = uVar154;
  auVar87._16_4_ = uVar154;
  auVar87._20_4_ = uVar154;
  auVar87._24_4_ = uVar154;
  auVar87._28_4_ = uVar154;
  auVar86 = vmaxps_avx512vl(auVar86,auVar87);
  auVar88 = vmaxps_avx(auVar88,auVar86);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  auVar86._16_4_ = 0x3f7ffffa;
  auVar86._20_4_ = 0x3f7ffffa;
  auVar86._24_4_ = 0x3f7ffffa;
  auVar86._28_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar88,auVar86);
  auVar88 = vpmaxsd_avx2(auVar92,auVar98);
  auVar86 = vpmaxsd_avx2(auVar93,auVar96);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar86 = vpmaxsd_avx2(auVar94,auVar83);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar90._4_4_ = uVar154;
  auVar90._0_4_ = uVar154;
  auVar90._8_4_ = uVar154;
  auVar90._12_4_ = uVar154;
  auVar90._16_4_ = uVar154;
  auVar90._20_4_ = uVar154;
  auVar90._24_4_ = uVar154;
  auVar90._28_4_ = uVar154;
  auVar86 = vminps_avx512vl(auVar86,auVar90);
  auVar88 = vminps_avx(auVar88,auVar86);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar91);
  uVar15 = vcmpps_avx512vl(local_5c0,auVar88,2);
  uVar17 = vpcmpgtd_avx512vl(auVar89,_DAT_01fb4ba0);
  uVar63 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar17));
  auVar152 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar152);
LAB_01a16722:
  if (uVar63 == 0) {
LAB_01a18f89:
    return uVar63 != 0;
  }
  lVar19 = 0;
  for (uVar58 = uVar63; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    lVar19 = lVar19 + 1;
  }
  uVar2 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar19 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar71 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar58);
  auVar13 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * (uVar58 + 1));
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_7c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar69 = vunpcklps_avx512vl(local_7a0._0_16_,local_7c0._0_16_);
  _local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar74 = local_7e0._0_16_;
  local_9b0 = vinsertps_avx512f(auVar69,auVar74,0x28);
  auVar76._8_4_ = 0xbeaaaaab;
  auVar76._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar76._12_4_ = 0xbeaaaaab;
  auVar80 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar58 * (long)pGVar3[2].pointQueryFunc),auVar71,auVar76);
  auVar73 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar58 + 1)),auVar13,auVar76);
  auVar218._0_4_ = auVar13._0_4_ + auVar71._0_4_ + auVar80._0_4_ + auVar73._0_4_;
  auVar218._4_4_ = auVar13._4_4_ + auVar71._4_4_ + auVar80._4_4_ + auVar73._4_4_;
  auVar218._8_4_ = auVar13._8_4_ + auVar71._8_4_ + auVar80._8_4_ + auVar73._8_4_;
  auVar218._12_4_ = auVar13._12_4_ + auVar71._12_4_ + auVar80._12_4_ + auVar73._12_4_;
  auVar75._8_4_ = 0x3e800000;
  auVar75._0_8_ = 0x3e8000003e800000;
  auVar75._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar218,auVar75);
  auVar69 = vsubps_avx(auVar69,auVar72);
  auVar69 = vdpps_avx(auVar69,local_9b0,0x7f);
  auVar152 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar152);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  fVar1 = *(float *)(ray + k * 4 + 0xc0);
  auVar81._4_12_ = ZEXT812(0) << 0x20;
  auVar81._0_4_ = local_9c0._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar81);
  auVar79 = vfnmadd213ss_fma(auVar70,local_9c0,ZEXT416(0x40000000));
  local_5a0 = auVar69._0_4_ * auVar70._0_4_ * auVar79._0_4_;
  auVar226 = ZEXT3264(_DAT_01f7b040);
  auVar77._4_4_ = local_5a0;
  auVar77._0_4_ = local_5a0;
  auVar77._8_4_ = local_5a0;
  auVar77._12_4_ = local_5a0;
  fStack_750 = local_5a0;
  _local_760 = auVar77;
  fStack_74c = local_5a0;
  fStack_748 = local_5a0;
  fStack_744 = local_5a0;
  auVar69 = vfmadd231ps_fma(auVar72,local_9b0,auVar77);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar72 = vsubps_avx(auVar73,auVar69);
  auVar73 = vsubps_avx(auVar80,auVar69);
  auVar13 = vsubps_avx(auVar13,auVar69);
  uVar154 = auVar71._0_4_;
  local_9e0._4_4_ = uVar154;
  local_9e0._0_4_ = uVar154;
  local_9e0._8_4_ = uVar154;
  local_9e0._12_4_ = uVar154;
  local_9e0._16_4_ = uVar154;
  local_9e0._20_4_ = uVar154;
  local_9e0._24_4_ = uVar154;
  local_9e0._28_4_ = uVar154;
  auVar238 = ZEXT3264(local_9e0);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_8a0 = ZEXT1632(auVar71);
  local_a00 = vpermps_avx512vl(auVar106,local_8a0);
  auVar249 = ZEXT3264(local_a00);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  local_a20 = vpermps_avx2(auVar107,local_8a0);
  auVar246 = ZEXT3264(local_a20);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  local_a40 = vpermps_avx2(auVar108,local_8a0);
  auVar235 = ZEXT3264(local_a40);
  fVar138 = auVar73._0_4_;
  auVar247._4_4_ = fVar138;
  auVar247._0_4_ = fVar138;
  auVar247._8_4_ = fVar138;
  auVar247._12_4_ = fVar138;
  auVar247._16_4_ = fVar138;
  auVar247._20_4_ = fVar138;
  auVar247._24_4_ = fVar138;
  auVar247._28_4_ = fVar138;
  local_8e0 = ZEXT1632(auVar73);
  local_a60 = vpermps_avx2(auVar106,local_8e0);
  auVar248 = ZEXT3264(local_a60);
  local_a80 = vpermps_avx512vl(auVar107,local_8e0);
  local_aa0 = vpermps_avx2(auVar108,local_8e0);
  auVar88 = vbroadcastss_avx512vl(auVar72);
  local_8c0 = ZEXT1632(auVar72);
  auVar86 = vpermps_avx512vl(auVar106,local_8c0);
  auVar87 = vpermps_avx512vl(auVar107,local_8c0);
  auVar90 = vpermps_avx512vl(auVar108,local_8c0);
  auVar91 = vbroadcastss_avx512vl(auVar13);
  _local_900 = ZEXT1632(auVar13);
  auVar89 = vpermps_avx512vl(auVar106,_local_900);
  auVar92 = vpermps_avx512vl(auVar107,_local_900);
  auVar93 = vpermps_avx512vl(auVar108,_local_900);
  auVar237 = ZEXT3264(local_aa0);
  auVar71 = vmulss_avx512f(auVar74,auVar74);
  auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),local_7c0,local_7c0);
  local_580 = vfmadd231ps_avx512vl(auVar94,local_7a0,local_7a0);
  local_560._0_4_ = local_580._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar105);
  local_960 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar1 - local_5a0;
  auVar231 = ZEXT3264(local_a80);
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  uVar58 = 0;
  bVar57 = 0;
  local_cd4 = 1;
  auVar152 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar152);
  auVar71 = vsqrtss_avx(local_9c0,local_9c0);
  auVar13 = vsqrtss_avx(local_9c0,local_9c0);
  auVar152 = ZEXT3264(local_a60);
  local_650 = ZEXT816(0x3f80000000000000);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar251 = ZEXT3264(auVar94);
  do {
    auVar69 = vmovshdup_avx(local_650);
    auVar69 = vsubps_avx(auVar69,local_650);
    fVar169 = auVar69._0_4_;
    fVar170 = fVar169 * 0.04761905;
    auVar193._0_4_ = local_650._0_4_;
    auVar193._4_4_ = auVar193._0_4_;
    auVar193._8_4_ = auVar193._0_4_;
    auVar193._12_4_ = auVar193._0_4_;
    auVar193._16_4_ = auVar193._0_4_;
    auVar193._20_4_ = auVar193._0_4_;
    auVar193._24_4_ = auVar193._0_4_;
    auVar193._28_4_ = auVar193._0_4_;
    auVar78._4_4_ = fVar169;
    auVar78._0_4_ = fVar169;
    auVar78._8_4_ = fVar169;
    auVar78._12_4_ = fVar169;
    auVar210._16_4_ = fVar169;
    auVar210._0_16_ = auVar78;
    auVar210._20_4_ = fVar169;
    auVar210._24_4_ = fVar169;
    auVar210._28_4_ = fVar169;
    auVar69 = vfmadd231ps_fma(auVar193,auVar210,auVar226._0_32_);
    auVar250 = auVar251._0_32_;
    auVar94 = vsubps_avx512vl(auVar250,ZEXT1632(auVar69));
    fVar153 = auVar69._0_4_;
    fVar166 = auVar69._4_4_;
    auVar216._4_4_ = fVar138 * fVar166;
    auVar216._0_4_ = fVar138 * fVar153;
    fVar167 = auVar69._8_4_;
    auVar216._8_4_ = fVar138 * fVar167;
    fVar168 = auVar69._12_4_;
    auVar216._12_4_ = fVar138 * fVar168;
    auVar216._16_4_ = fVar138 * 0.0;
    auVar216._20_4_ = fVar138 * 0.0;
    auVar216._24_4_ = fVar138 * 0.0;
    auVar216._28_4_ = auVar193._0_4_;
    auVar114._4_4_ = auVar152._4_4_ * fVar166;
    auVar114._0_4_ = auVar152._0_4_ * fVar153;
    auVar114._8_4_ = auVar152._8_4_ * fVar167;
    auVar114._12_4_ = auVar152._12_4_ * fVar168;
    auVar114._16_4_ = auVar152._16_4_ * 0.0;
    auVar114._20_4_ = auVar152._20_4_ * 0.0;
    auVar114._24_4_ = auVar152._24_4_ * 0.0;
    auVar114._28_4_ = fVar169;
    auVar53._4_4_ = auVar231._4_4_ * fVar166;
    auVar53._0_4_ = auVar231._0_4_ * fVar153;
    auVar53._8_4_ = auVar231._8_4_ * fVar167;
    auVar53._12_4_ = auVar231._12_4_ * fVar168;
    auVar53._16_4_ = auVar231._16_4_ * 0.0;
    auVar53._20_4_ = auVar231._20_4_ * 0.0;
    auVar53._24_4_ = auVar231._24_4_ * 0.0;
    auVar53._28_4_ = fVar138;
    auVar226._0_4_ = auVar237._0_4_ * fVar153;
    auVar226._4_4_ = auVar237._4_4_ * fVar166;
    auVar226._8_4_ = auVar237._8_4_ * fVar167;
    auVar226._12_4_ = auVar237._12_4_ * fVar168;
    auVar226._16_4_ = auVar237._16_4_ * 0.0;
    auVar226._20_4_ = auVar237._20_4_ * 0.0;
    auVar226._28_36_ = auVar231._28_36_;
    auVar226._24_4_ = auVar237._24_4_ * 0.0;
    auVar72 = vfmadd231ps_fma(auVar216,auVar94,auVar238._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar114,auVar94,auVar249._0_32_);
    auVar73 = vfmadd231ps_fma(auVar53,auVar94,auVar246._0_32_);
    auVar80 = vfmadd231ps_fma(auVar226._0_32_,auVar94,auVar235._0_32_);
    auVar84 = vmulps_avx512vl(auVar88,ZEXT1632(auVar69));
    auVar96 = ZEXT1632(auVar69);
    auVar85 = vmulps_avx512vl(auVar86,auVar96);
    auVar82 = vmulps_avx512vl(auVar87,auVar96);
    auVar83 = vmulps_avx512vl(auVar90,auVar96);
    auVar79 = vfmadd231ps_fma(auVar84,auVar94,auVar247);
    auVar70 = vfmadd231ps_fma(auVar85,auVar94,auVar152._0_32_);
    auVar74 = vfmadd231ps_fma(auVar82,auVar94,auVar231._0_32_);
    auVar75 = vfmadd231ps_fma(auVar83,auVar94,auVar237._0_32_);
    auVar84 = vmulps_avx512vl(auVar91,auVar96);
    auVar85 = vmulps_avx512vl(auVar89,auVar96);
    auVar82 = vmulps_avx512vl(auVar92,auVar96);
    auVar83 = vmulps_avx512vl(auVar93,auVar96);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar88);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar94,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,auVar90);
    auVar231._28_36_ = auVar248._28_36_;
    auVar231._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar79._12_4_,
                            CONCAT48(fVar167 * auVar79._8_4_,
                                     CONCAT44(fVar166 * auVar79._4_4_,fVar153 * auVar79._0_4_))));
    auVar96 = vmulps_avx512vl(auVar96,ZEXT1632(auVar70));
    auVar97 = vmulps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar74));
    auVar98 = vmulps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar75));
    auVar69 = vfmadd231ps_fma(auVar231._0_32_,auVar94,ZEXT1632(auVar72));
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,ZEXT1632(auVar73));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,ZEXT1632(auVar80));
    auVar229._0_4_ = auVar84._0_4_ * fVar153;
    auVar229._4_4_ = auVar84._4_4_ * fVar166;
    auVar229._8_4_ = auVar84._8_4_ * fVar167;
    auVar229._12_4_ = auVar84._12_4_ * fVar168;
    auVar229._16_4_ = auVar84._16_4_ * 0.0;
    auVar229._20_4_ = auVar84._20_4_ * 0.0;
    auVar229._24_4_ = auVar84._24_4_ * 0.0;
    auVar229._28_4_ = 0;
    auVar115._4_4_ = auVar85._4_4_ * fVar166;
    auVar115._0_4_ = auVar85._0_4_ * fVar153;
    auVar115._8_4_ = auVar85._8_4_ * fVar167;
    auVar115._12_4_ = auVar85._12_4_ * fVar168;
    auVar115._16_4_ = auVar85._16_4_ * 0.0;
    auVar115._20_4_ = auVar85._20_4_ * 0.0;
    auVar115._24_4_ = auVar85._24_4_ * 0.0;
    auVar115._28_4_ = auVar84._28_4_;
    auVar116._4_4_ = auVar82._4_4_ * fVar166;
    auVar116._0_4_ = auVar82._0_4_ * fVar153;
    auVar116._8_4_ = auVar82._8_4_ * fVar167;
    auVar116._12_4_ = auVar82._12_4_ * fVar168;
    auVar116._16_4_ = auVar82._16_4_ * 0.0;
    auVar116._20_4_ = auVar82._20_4_ * 0.0;
    auVar116._24_4_ = auVar82._24_4_ * 0.0;
    auVar116._28_4_ = auVar85._28_4_;
    auVar119._4_4_ = auVar83._4_4_ * fVar166;
    auVar119._0_4_ = auVar83._0_4_ * fVar153;
    auVar119._8_4_ = auVar83._8_4_ * fVar167;
    auVar119._12_4_ = auVar83._12_4_ * fVar168;
    auVar119._16_4_ = auVar83._16_4_ * 0.0;
    auVar119._20_4_ = auVar83._20_4_ * 0.0;
    auVar119._24_4_ = auVar83._24_4_ * 0.0;
    auVar119._28_4_ = auVar82._28_4_;
    auVar72 = vfmadd231ps_fma(auVar229,auVar94,ZEXT1632(auVar79));
    auVar73 = vfmadd231ps_fma(auVar115,auVar94,ZEXT1632(auVar70));
    auVar80 = vfmadd231ps_fma(auVar116,auVar94,ZEXT1632(auVar74));
    auVar79 = vfmadd231ps_fma(auVar119,auVar94,ZEXT1632(auVar75));
    auVar120._28_4_ = auVar95._28_4_;
    auVar120._0_28_ =
         ZEXT1628(CONCAT412(auVar73._12_4_ * fVar168,
                            CONCAT48(auVar73._8_4_ * fVar167,
                                     CONCAT44(auVar73._4_4_ * fVar166,auVar73._0_4_ * fVar153))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar72._12_4_,
                                                 CONCAT48(fVar167 * auVar72._8_4_,
                                                          CONCAT44(fVar166 * auVar72._4_4_,
                                                                   fVar153 * auVar72._0_4_)))),
                              auVar94,ZEXT1632(auVar69));
    auVar99 = vfmadd231ps_avx512vl(auVar120,auVar94,auVar96);
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar168,
                                             CONCAT48(auVar80._8_4_ * fVar167,
                                                      CONCAT44(auVar80._4_4_ * fVar166,
                                                               auVar80._0_4_ * fVar153)))),auVar94,
                          auVar97);
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar168,
                                            CONCAT48(auVar79._8_4_ * fVar167,
                                                     CONCAT44(auVar79._4_4_ * fVar166,
                                                              auVar79._0_4_ * fVar153)))),auVar98,
                         auVar94);
    auVar94 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar69));
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar73),auVar96);
    auVar85 = vsubps_avx512vl(ZEXT1632(auVar80),auVar97);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar79),auVar98);
    auVar240._0_4_ = fVar170 * auVar94._0_4_ * 3.0;
    auVar240._4_4_ = fVar170 * auVar94._4_4_ * 3.0;
    auVar240._8_4_ = fVar170 * auVar94._8_4_ * 3.0;
    auVar240._12_4_ = fVar170 * auVar94._12_4_ * 3.0;
    auVar240._16_4_ = fVar170 * auVar94._16_4_ * 3.0;
    auVar240._20_4_ = fVar170 * auVar94._20_4_ * 3.0;
    auVar240._24_4_ = fVar170 * auVar94._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar245._0_4_ = fVar170 * auVar84._0_4_ * 3.0;
    auVar245._4_4_ = fVar170 * auVar84._4_4_ * 3.0;
    auVar245._8_4_ = fVar170 * auVar84._8_4_ * 3.0;
    auVar245._12_4_ = fVar170 * auVar84._12_4_ * 3.0;
    auVar245._16_4_ = fVar170 * auVar84._16_4_ * 3.0;
    auVar245._20_4_ = fVar170 * auVar84._20_4_ * 3.0;
    auVar245._24_4_ = fVar170 * auVar84._24_4_ * 3.0;
    auVar245._28_4_ = 0;
    auVar37._4_4_ = fVar170 * auVar85._4_4_ * 3.0;
    auVar37._0_4_ = fVar170 * auVar85._0_4_ * 3.0;
    auVar37._8_4_ = fVar170 * auVar85._8_4_ * 3.0;
    auVar37._12_4_ = fVar170 * auVar85._12_4_ * 3.0;
    auVar37._16_4_ = fVar170 * auVar85._16_4_ * 3.0;
    auVar37._20_4_ = fVar170 * auVar85._20_4_ * 3.0;
    auVar37._24_4_ = fVar170 * auVar85._24_4_ * 3.0;
    auVar37._28_4_ = auVar83._28_4_;
    fVar153 = auVar82._0_4_ * 3.0 * fVar170;
    fVar166 = auVar82._4_4_ * 3.0 * fVar170;
    auVar38._4_4_ = fVar166;
    auVar38._0_4_ = fVar153;
    fVar167 = auVar82._8_4_ * 3.0 * fVar170;
    auVar38._8_4_ = fVar167;
    fVar168 = auVar82._12_4_ * 3.0 * fVar170;
    auVar38._12_4_ = fVar168;
    fVar169 = auVar82._16_4_ * 3.0 * fVar170;
    auVar38._16_4_ = fVar169;
    fVar197 = auVar82._20_4_ * 3.0 * fVar170;
    auVar38._20_4_ = fVar197;
    fVar171 = auVar82._24_4_ * 3.0 * fVar170;
    auVar38._24_4_ = fVar171;
    auVar38._28_4_ = fVar170;
    auVar69 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar69);
    auVar83 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar96 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar84 = ZEXT1632(auVar69);
    auVar97 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar84);
    auVar223._0_4_ = auVar95._0_4_ + fVar153;
    auVar223._4_4_ = auVar95._4_4_ + fVar166;
    auVar223._8_4_ = auVar95._8_4_ + fVar167;
    auVar223._12_4_ = auVar95._12_4_ + fVar168;
    auVar223._16_4_ = auVar95._16_4_ + fVar169;
    auVar223._20_4_ = auVar95._20_4_ + fVar197;
    auVar223._24_4_ = auVar95._24_4_ + fVar171;
    auVar223._28_4_ = auVar95._28_4_ + fVar170;
    auVar94 = vmaxps_avx(auVar95,auVar223);
    auVar98 = vminps_avx512vl(auVar95,auVar223);
    auVar101 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar84);
    auVar102 = vpermt2ps_avx512vl(auVar240,_DAT_01fb9fc0,auVar84);
    auVar103 = vpermt2ps_avx512vl(auVar245,_DAT_01fb9fc0,auVar84);
    auVar114 = ZEXT1632(auVar69);
    auVar104 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar114);
    auVar95 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar114);
    auVar95 = vsubps_avx(auVar101,auVar95);
    auVar84 = vsubps_avx(auVar83,ZEXT1632(auVar70));
    auVar85 = vsubps_avx(auVar96,auVar99);
    auVar82 = vsubps_avx(auVar97,auVar100);
    auVar105 = vmulps_avx512vl(auVar85,auVar37);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar245,auVar82);
    auVar106 = vmulps_avx512vl(auVar82,auVar240);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar37,auVar84);
    auVar107 = vmulps_avx512vl(auVar84,auVar245);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar240,auVar85);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar82,auVar82);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar85,auVar85);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar84,auVar84);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar250);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vmulps_avx512vl(auVar85,auVar104);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar103,auVar82);
    auVar109 = vmulps_avx512vl(auVar82,auVar102);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar84);
    auVar110 = vmulps_avx512vl(auVar84,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar102,auVar85);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar95,auVar101);
    auVar94 = vmaxps_avx512vl(auVar94,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar94);
    auVar94 = vminps_avx(auVar95,auVar101);
    auVar94 = vminps_avx512vl(auVar98,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar105);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar107,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar94,auVar110);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    auVar98 = vrsqrt14ps_avx512vl(auVar106);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar106,auVar111);
    fVar153 = auVar98._0_4_;
    fVar166 = auVar98._4_4_;
    fVar167 = auVar98._8_4_;
    fVar168 = auVar98._12_4_;
    fVar170 = auVar98._16_4_;
    fVar169 = auVar98._20_4_;
    fVar197 = auVar98._24_4_;
    auVar39._4_4_ = fVar166 * fVar166 * fVar166 * auVar101._4_4_;
    auVar39._0_4_ = fVar153 * fVar153 * fVar153 * auVar101._0_4_;
    auVar39._8_4_ = fVar167 * fVar167 * fVar167 * auVar101._8_4_;
    auVar39._12_4_ = fVar168 * fVar168 * fVar168 * auVar101._12_4_;
    auVar39._16_4_ = fVar170 * fVar170 * fVar170 * auVar101._16_4_;
    auVar39._20_4_ = fVar169 * fVar169 * fVar169 * auVar101._20_4_;
    auVar39._24_4_ = fVar197 * fVar197 * fVar197 * auVar101._24_4_;
    auVar39._28_4_ = auVar107._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar39,auVar98,auVar112);
    auVar248 = ZEXT3264(auVar98);
    auVar101 = vmulps_avx512vl(auVar84,auVar98);
    auVar105 = vmulps_avx512vl(auVar85,auVar98);
    auVar106 = vmulps_avx512vl(auVar82,auVar98);
    auVar216 = ZEXT1632(auVar70);
    auVar107 = vsubps_avx512vl(auVar114,auVar216);
    auVar108 = vsubps_avx512vl(auVar114,auVar99);
    auVar109 = vsubps_avx512vl(auVar114,auVar100);
    auVar110 = vmulps_avx512vl(_local_7e0,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_7c0,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_7a0,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(_local_7e0,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_7c0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,local_7a0);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
    auVar105 = vmulps_avx512vl(auVar112,auVar112);
    auVar106 = vsubps_avx512vl(local_560,auVar105);
    auVar113 = vmulps_avx512vl(auVar112,auVar101);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar101,auVar101);
    auVar111 = vsubps_avx512vl(auVar111,auVar113);
    auVar95 = vsubps_avx512vl(auVar111,auVar95);
    local_800 = vmulps_avx512vl(auVar110,auVar110);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_820 = vmulps_avx512vl(auVar106,auVar113);
    auVar113 = vmulps_avx512vl(_local_820,auVar95);
    auVar113 = vsubps_avx512vl(local_800,auVar113);
    uVar67 = vcmpps_avx512vl(auVar113,auVar114,5);
    bVar54 = (byte)uVar67;
    if (bVar54 == 0) {
LAB_01a173b7:
      auVar226 = ZEXT3264(_DAT_01f7b040);
      auVar238 = ZEXT3264(local_9e0);
      auVar249 = ZEXT3264(local_a00);
      auVar246 = ZEXT3264(local_a20);
      auVar235 = ZEXT3264(local_a40);
      auVar152 = ZEXT3264(local_a60);
      auVar231 = ZEXT3264(local_a80);
      auVar237 = ZEXT3264(local_aa0);
    }
    else {
      local_740._0_32_ = auVar111;
      auVar113 = vsqrtps_avx512vl(auVar113);
      auVar114 = vaddps_avx512vl(auVar106,auVar106);
      local_980 = vrcp14ps_avx512vl(auVar114);
      in_ZMM31 = ZEXT3264(local_980);
      auVar115 = vfnmadd213ps_avx512vl(local_980,auVar114,auVar250);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_980,local_980);
      auVar250._8_4_ = 0x80000000;
      auVar250._0_8_ = 0x8000000080000000;
      auVar250._12_4_ = 0x80000000;
      auVar250._16_4_ = 0x80000000;
      auVar250._20_4_ = 0x80000000;
      auVar250._24_4_ = 0x80000000;
      auVar250._28_4_ = 0x80000000;
      local_840 = vxorps_avx512vl(auVar110,auVar250);
      auVar116 = vsubps_avx512vl(local_840,auVar113);
      local_920 = vmulps_avx512vl(auVar116,auVar115);
      auVar113 = vsubps_avx512vl(auVar113,auVar110);
      local_9a0 = vmulps_avx512vl(auVar113,auVar115);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vblendmps_avx512vl(auVar113,local_920);
      auVar117._0_4_ =
           (uint)(bVar54 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar113._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar64 * auVar115._4_4_ | (uint)!bVar64 * auVar113._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar64 * auVar115._8_4_ | (uint)!bVar64 * auVar113._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar64 * auVar115._12_4_ | (uint)!bVar64 * auVar113._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar64 * auVar115._16_4_ | (uint)!bVar64 * auVar113._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar64 * auVar115._20_4_ | (uint)!bVar64 * auVar113._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar64 * auVar115._24_4_ | (uint)!bVar64 * auVar113._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar117._28_4_ = (uint)bVar64 * auVar115._28_4_ | (uint)!bVar64 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar113,local_9a0);
      auVar118._0_4_ =
           (uint)(bVar54 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar113._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar64 * auVar115._4_4_ | (uint)!bVar64 * auVar113._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar64 * auVar115._8_4_ | (uint)!bVar64 * auVar113._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar64 * auVar115._12_4_ | (uint)!bVar64 * auVar113._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar64 * auVar115._16_4_ | (uint)!bVar64 * auVar113._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar64 * auVar115._20_4_ | (uint)!bVar64 * auVar113._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar64 * auVar115._24_4_ | (uint)!bVar64 * auVar113._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar118._28_4_ = (uint)bVar64 * auVar115._28_4_ | (uint)!bVar64 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar113);
      local_860 = vmaxps_avx512vl(local_580,auVar113);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_880 = vmulps_avx512vl(local_860,auVar30);
      vandps_avx512vl(auVar106,auVar113);
      uVar61 = vcmpps_avx512vl(local_880,local_880,1);
      uVar67 = uVar67 & uVar61;
      bVar62 = (byte)uVar67;
      if (bVar62 != 0) {
        uVar61 = vcmpps_avx512vl(auVar95,_DAT_01f7b000,2);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar95,auVar105);
        bVar59 = (byte)uVar61;
        uVar68 = (uint)(bVar59 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar59 & 1) * local_880._0_4_;
        bVar64 = (bool)((byte)(uVar61 >> 1) & 1);
        uVar131 = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * local_880._4_4_;
        bVar64 = (bool)((byte)(uVar61 >> 2) & 1);
        uVar132 = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * local_880._8_4_;
        bVar64 = (bool)((byte)(uVar61 >> 3) & 1);
        uVar133 = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * local_880._12_4_;
        bVar64 = (bool)((byte)(uVar61 >> 4) & 1);
        uVar134 = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * local_880._16_4_;
        bVar64 = (bool)((byte)(uVar61 >> 5) & 1);
        uVar135 = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * local_880._20_4_;
        bVar64 = (bool)((byte)(uVar61 >> 6) & 1);
        uVar136 = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * local_880._24_4_;
        bVar64 = SUB81(uVar61 >> 7,0);
        uVar137 = (uint)bVar64 * auVar106._28_4_ | (uint)!bVar64 * local_880._28_4_;
        auVar117._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar117._0_4_;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar117._4_4_ = bVar64 * uVar131 | !bVar64 * auVar117._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar117._8_4_ = bVar64 * uVar132 | !bVar64 * auVar117._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar117._12_4_ = bVar64 * uVar133 | !bVar64 * auVar117._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar117._16_4_ = bVar64 * uVar134 | !bVar64 * auVar117._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar117._20_4_ = bVar64 * uVar135 | !bVar64 * auVar117._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar117._24_4_ = bVar64 * uVar136 | !bVar64 * auVar117._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar117._28_4_ = bVar64 * uVar137 | !bVar64 * auVar117._28_4_;
        auVar95 = vblendmps_avx512vl(auVar105,auVar95);
        bVar64 = (bool)((byte)(uVar61 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar61 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar61 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar61 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar61 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
        bVar12 = SUB81(uVar61 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar59 & 1) * auVar95._0_4_ | !(bool)(bVar59 & 1) * uVar68) |
             !(bool)(bVar62 & 1) * auVar118._0_4_;
        bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar6 * ((uint)bVar64 * auVar95._4_4_ | !bVar64 * uVar131) |
             !bVar6 * auVar118._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar64 * ((uint)bVar7 * auVar95._8_4_ | !bVar7 * uVar132) |
             !bVar64 * auVar118._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar64 * ((uint)bVar8 * auVar95._12_4_ | !bVar8 * uVar133) |
             !bVar64 * auVar118._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar64 * ((uint)bVar9 * auVar95._16_4_ | !bVar9 * uVar134) |
             !bVar64 * auVar118._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar95._20_4_ | !bVar10 * uVar135) |
             !bVar64 * auVar118._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar95._24_4_ | !bVar11 * uVar136) |
             !bVar64 * auVar118._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar95._28_4_ | !bVar12 * uVar137) |
             !bVar64 * auVar118._28_4_;
        bVar54 = (~bVar62 | bVar59) & bVar54;
      }
      if ((bVar54 & 0x7f) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar94);
        goto LAB_01a173b7;
      }
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = vxorps_avx512vl(auVar104,auVar95);
      auVar102 = vxorps_avx512vl(auVar102,auVar95);
      auVar226 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar103 = vxorps_avx512vl(auVar103,auVar95);
      auVar69 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_960._0_4_));
      auVar105 = vbroadcastss_avx512vl(auVar69);
      auVar105 = vminps_avx512vl(auVar105,auVar118);
      auVar52._4_4_ = fStack_59c;
      auVar52._0_4_ = local_5a0;
      auVar52._8_4_ = fStack_598;
      auVar52._12_4_ = fStack_594;
      auVar52._16_4_ = fStack_590;
      auVar52._20_4_ = fStack_58c;
      auVar52._24_4_ = fStack_588;
      auVar52._28_4_ = fStack_584;
      auVar106 = vmaxps_avx512vl(auVar52,auVar117);
      auVar109 = vmulps_avx512vl(auVar109,auVar37);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar245,auVar109);
      auVar69 = vfmadd213ps_fma(auVar107,auVar240,auVar108);
      in_ZMM31 = ZEXT3264(_local_7e0);
      auVar107 = vmulps_avx512vl(_local_7e0,auVar37);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_7c0,auVar245);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_7a0,auVar240);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar108,auVar109,1);
      auVar113 = vxorps_avx512vl(ZEXT1632(auVar69),auVar95);
      auVar115 = vrcp14ps_avx512vl(auVar107);
      auVar116 = vxorps_avx512vl(auVar107,auVar95);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar120 = vfnmadd213ps_avx512vl(auVar115,auVar107,auVar119);
      auVar69 = vfmadd132ps_fma(auVar120,auVar115,auVar115);
      fVar153 = auVar69._0_4_ * auVar113._0_4_;
      fVar166 = auVar69._4_4_ * auVar113._4_4_;
      auVar40._4_4_ = fVar166;
      auVar40._0_4_ = fVar153;
      fVar167 = auVar69._8_4_ * auVar113._8_4_;
      auVar40._8_4_ = fVar167;
      fVar168 = auVar69._12_4_ * auVar113._12_4_;
      auVar40._12_4_ = fVar168;
      fVar170 = auVar113._16_4_ * 0.0;
      auVar40._16_4_ = fVar170;
      fVar169 = auVar113._20_4_ * 0.0;
      auVar40._20_4_ = fVar169;
      fVar197 = auVar113._24_4_ * 0.0;
      auVar40._24_4_ = fVar197;
      auVar40._28_4_ = auVar113._28_4_;
      uVar17 = vcmpps_avx512vl(auVar107,auVar116,1);
      bVar62 = (byte)uVar15 | (byte)uVar17;
      auVar241._8_4_ = 0xff800000;
      auVar241._0_8_ = 0xff800000ff800000;
      auVar241._12_4_ = 0xff800000;
      auVar241._16_4_ = 0xff800000;
      auVar241._20_4_ = 0xff800000;
      auVar241._24_4_ = 0xff800000;
      auVar241._28_4_ = 0xff800000;
      auVar115 = vblendmps_avx512vl(auVar40,auVar241);
      auVar121._0_4_ = (uint)(bVar62 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar62 & 1) * -0x800000;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar64 * auVar115._4_4_ | (uint)!bVar64 * -0x800000;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar64 * auVar115._8_4_ | (uint)!bVar64 * -0x800000;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar64 * auVar115._12_4_ | (uint)!bVar64 * -0x800000;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar64 * auVar115._16_4_ | (uint)!bVar64 * -0x800000;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar64 * auVar115._20_4_ | (uint)!bVar64 * -0x800000;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar64 * auVar115._24_4_ | (uint)!bVar64 * -0x800000;
      auVar121._28_4_ =
           (uint)(bVar62 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar62 >> 7) * -0x800000;
      auVar115 = vmaxps_avx512vl(auVar106,auVar121);
      uVar17 = vcmpps_avx512vl(auVar107,auVar116,6);
      bVar62 = (byte)uVar15 | (byte)uVar17;
      auVar122._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar153;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar166;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar167;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar168;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar170;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar169;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar197;
      auVar122._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar113._28_4_;
      auVar105 = vminps_avx512vl(auVar105,auVar122);
      auVar69 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
      auVar83 = vsubps_avx512vl(ZEXT1632(auVar69),auVar83);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar69),auVar96);
      auVar106 = ZEXT1632(auVar69);
      auVar97 = vsubps_avx512vl(auVar106,auVar97);
      auVar97 = vmulps_avx512vl(auVar97,auVar104);
      auVar96 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar96);
      auVar83 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar83);
      auVar96 = vmulps_avx512vl(_local_7e0,auVar104);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_7c0,auVar103);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_7a0,auVar102);
      vandps_avx512vl(auVar96,auVar108);
      uVar15 = vcmpps_avx512vl(auVar96,auVar109,1);
      auVar83 = vxorps_avx512vl(auVar83,auVar95);
      auVar97 = vrcp14ps_avx512vl(auVar96);
      auVar95 = vxorps_avx512vl(auVar96,auVar95);
      auVar102 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar119);
      auVar69 = vfmadd132ps_fma(auVar102,auVar97,auVar97);
      fVar153 = auVar69._0_4_ * auVar83._0_4_;
      fVar166 = auVar69._4_4_ * auVar83._4_4_;
      auVar41._4_4_ = fVar166;
      auVar41._0_4_ = fVar153;
      fVar167 = auVar69._8_4_ * auVar83._8_4_;
      auVar41._8_4_ = fVar167;
      fVar168 = auVar69._12_4_ * auVar83._12_4_;
      auVar41._12_4_ = fVar168;
      fVar170 = auVar83._16_4_ * 0.0;
      auVar41._16_4_ = fVar170;
      fVar169 = auVar83._20_4_ * 0.0;
      auVar41._20_4_ = fVar169;
      fVar197 = auVar83._24_4_ * 0.0;
      auVar41._24_4_ = fVar197;
      auVar41._28_4_ = auVar83._28_4_;
      uVar17 = vcmpps_avx512vl(auVar96,auVar95,1);
      bVar62 = (byte)uVar15 | (byte)uVar17;
      auVar31._8_4_ = 0xff800000;
      auVar31._0_8_ = 0xff800000ff800000;
      auVar31._12_4_ = 0xff800000;
      auVar31._16_4_ = 0xff800000;
      auVar31._20_4_ = 0xff800000;
      auVar31._24_4_ = 0xff800000;
      auVar31._28_4_ = 0xff800000;
      auVar102 = vblendmps_avx512vl(auVar41,auVar31);
      auVar123._0_4_ =
           (uint)(bVar62 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar97._0_4_;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar64 * auVar102._4_4_ | (uint)!bVar64 * auVar97._4_4_;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar64 * auVar102._8_4_ | (uint)!bVar64 * auVar97._8_4_;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar64 * auVar102._12_4_ | (uint)!bVar64 * auVar97._12_4_;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar64 * auVar102._16_4_ | (uint)!bVar64 * auVar97._16_4_;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar64 * auVar102._20_4_ | (uint)!bVar64 * auVar97._20_4_;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar64 * auVar102._24_4_ | (uint)!bVar64 * auVar97._24_4_;
      auVar123._28_4_ =
           (uint)(bVar62 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar97._28_4_;
      local_780 = vmaxps_avx(auVar115,auVar123);
      uVar17 = vcmpps_avx512vl(auVar96,auVar95,6);
      bVar62 = (byte)uVar15 | (byte)uVar17;
      auVar124._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar153;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar166;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar167;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar168;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar170;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar169;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar197;
      auVar124._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar83._28_4_;
      local_600 = vminps_avx(auVar105,auVar124);
      uVar15 = vcmpps_avx512vl(local_780,local_600,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar15;
      if (bVar54 == 0) {
        auVar251 = ZEXT3264(auVar119);
        goto LAB_01a173b7;
      }
      auVar95 = vmaxps_avx512vl(auVar106,auVar94);
      auVar94 = vfmadd213ps_avx512vl(local_920,auVar112,auVar101);
      fVar153 = auVar98._0_4_;
      fVar166 = auVar98._4_4_;
      auVar42._4_4_ = fVar166 * auVar94._4_4_;
      auVar42._0_4_ = fVar153 * auVar94._0_4_;
      fVar167 = auVar98._8_4_;
      auVar42._8_4_ = fVar167 * auVar94._8_4_;
      fVar168 = auVar98._12_4_;
      auVar42._12_4_ = fVar168 * auVar94._12_4_;
      fVar170 = auVar98._16_4_;
      auVar42._16_4_ = fVar170 * auVar94._16_4_;
      fVar169 = auVar98._20_4_;
      auVar42._20_4_ = fVar169 * auVar94._20_4_;
      fVar197 = auVar98._24_4_;
      auVar42._24_4_ = fVar197 * auVar94._24_4_;
      auVar42._28_4_ = auVar94._28_4_;
      auVar94 = vfmadd213ps_avx512vl(local_9a0,auVar112,auVar101);
      auVar43._4_4_ = fVar166 * auVar94._4_4_;
      auVar43._0_4_ = fVar153 * auVar94._0_4_;
      auVar43._8_4_ = fVar167 * auVar94._8_4_;
      auVar43._12_4_ = fVar168 * auVar94._12_4_;
      auVar43._16_4_ = fVar170 * auVar94._16_4_;
      auVar43._20_4_ = fVar169 * auVar94._20_4_;
      auVar43._24_4_ = fVar197 * auVar94._24_4_;
      auVar43._28_4_ = auVar94._28_4_;
      auVar94 = vminps_avx512vl(auVar42,auVar119);
      auVar83 = ZEXT832(0) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
      auVar96 = vminps_avx512vl(auVar43,auVar119);
      auVar44._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar94._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar44,auVar210,auVar193);
      auVar94 = vmaxps_avx(auVar96,ZEXT832(0) << 0x20);
      auVar45._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar94._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar45,auVar210,auVar193);
      auVar46._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar46._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar46._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar46._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar46._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar46._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar46._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar46._28_4_ = auVar95._28_4_;
      auVar94 = vsubps_avx(auVar111,auVar46);
      auVar47._4_4_ = auVar94._4_4_ * (float)local_820._4_4_;
      auVar47._0_4_ = auVar94._0_4_ * (float)local_820._0_4_;
      auVar47._8_4_ = auVar94._8_4_ * fStack_818;
      auVar47._12_4_ = auVar94._12_4_ * fStack_814;
      auVar47._16_4_ = auVar94._16_4_ * fStack_810;
      auVar47._20_4_ = auVar94._20_4_ * fStack_80c;
      auVar47._24_4_ = auVar94._24_4_ * fStack_808;
      auVar47._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(local_800,auVar47);
      uVar15 = vcmpps_avx512vl(auVar95,ZEXT832(0) << 0x20,5);
      bVar62 = (byte)uVar15;
      if (bVar62 == 0) {
        bVar62 = 0;
        auVar84 = ZEXT832(0) << 0x20;
        auVar152 = ZEXT864(0) << 0x20;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar239 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
      }
      else {
        auVar72 = vxorps_avx512vl(auVar78,auVar78);
        uVar67 = vcmpps_avx512vl(auVar95,auVar106,5);
        auVar95 = vsqrtps_avx(auVar95);
        auVar83 = vfnmadd213ps_avx512vl(auVar114,local_980,auVar119);
        auVar97 = vfmadd132ps_avx512vl(auVar83,local_980,local_980);
        auVar83 = vsubps_avx(local_840,auVar95);
        auVar102 = vmulps_avx512vl(auVar83,auVar97);
        auVar95 = vsubps_avx512vl(auVar95,auVar110);
        auVar97 = vmulps_avx512vl(auVar95,auVar97);
        auVar95 = vfmadd213ps_avx512vl(auVar112,auVar102,auVar101);
        auVar48._4_4_ = fVar166 * auVar95._4_4_;
        auVar48._0_4_ = fVar153 * auVar95._0_4_;
        auVar48._8_4_ = fVar167 * auVar95._8_4_;
        auVar48._12_4_ = fVar168 * auVar95._12_4_;
        auVar48._16_4_ = fVar170 * auVar95._16_4_;
        auVar48._20_4_ = fVar169 * auVar95._20_4_;
        auVar48._24_4_ = fVar197 * auVar95._24_4_;
        auVar48._28_4_ = auVar96._28_4_;
        auVar95 = vmulps_avx512vl(local_7a0,auVar102);
        auVar83 = vmulps_avx512vl(local_7c0,auVar102);
        auVar103 = vmulps_avx512vl(_local_7e0,auVar102);
        auVar96 = vfmadd213ps_avx512vl(auVar84,auVar48,auVar216);
        auVar95 = vsubps_avx512vl(auVar95,auVar96);
        auVar96 = vfmadd213ps_avx512vl(auVar85,auVar48,auVar99);
        auVar96 = vsubps_avx512vl(auVar83,auVar96);
        auVar69 = vfmadd213ps_fma(auVar48,auVar82,auVar100);
        auVar83 = vsubps_avx(auVar103,ZEXT1632(auVar69));
        auVar239 = auVar83._0_28_;
        auVar83 = vfmadd213ps_avx512vl(auVar112,auVar97,auVar101);
        auVar98 = vmulps_avx512vl(auVar98,auVar83);
        auVar248 = ZEXT3264(auVar98);
        auVar83 = vmulps_avx512vl(local_7a0,auVar97);
        auVar101 = vmulps_avx512vl(local_7c0,auVar97);
        auVar103 = vmulps_avx512vl(_local_7e0,auVar97);
        auVar69 = vfmadd213ps_fma(auVar84,auVar98,auVar216);
        auVar83 = vsubps_avx(auVar83,ZEXT1632(auVar69));
        auVar69 = vfmadd213ps_fma(auVar85,auVar98,auVar99);
        auVar84 = vsubps_avx512vl(auVar101,ZEXT1632(auVar69));
        auVar69 = vfmadd213ps_fma(auVar82,auVar98,auVar100);
        auVar85 = vsubps_avx512vl(auVar103,ZEXT1632(auVar69));
        auVar152 = ZEXT3264(auVar85);
        auVar194._8_4_ = 0x7f800000;
        auVar194._0_8_ = 0x7f8000007f800000;
        auVar194._12_4_ = 0x7f800000;
        auVar194._16_4_ = 0x7f800000;
        auVar194._20_4_ = 0x7f800000;
        auVar194._24_4_ = 0x7f800000;
        auVar194._28_4_ = 0x7f800000;
        auVar85 = vblendmps_avx512vl(auVar194,auVar102);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar125._0_4_ = (uint)bVar64 * auVar85._0_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar64 * auVar85._4_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar64 * auVar85._8_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar64 * auVar85._12_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar64 * auVar85._16_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar64 * auVar85._20_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar64 * auVar85._24_4_ | (uint)!bVar64 * 0x7f800000;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar125._28_4_ = (uint)bVar64 * auVar85._28_4_ | (uint)!bVar64 * 0x7f800000;
        auVar217._8_4_ = 0xff800000;
        auVar217._0_8_ = 0xff800000ff800000;
        auVar217._12_4_ = 0xff800000;
        auVar217._16_4_ = 0xff800000;
        auVar217._20_4_ = 0xff800000;
        auVar217._24_4_ = 0xff800000;
        auVar217._28_4_ = 0xff800000;
        auVar85 = vblendmps_avx512vl(auVar217,auVar97);
        bVar64 = (bool)((byte)uVar67 & 1);
        auVar126._0_4_ = (uint)bVar64 * auVar85._0_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar64 * auVar85._4_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar64 * auVar85._8_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar64 * auVar85._12_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar64 * auVar85._16_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar64 * auVar85._20_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar64 * auVar85._24_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar126._28_4_ = (uint)bVar64 * auVar85._28_4_ | (uint)!bVar64 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar85 = vmulps_avx512vl(local_860,auVar32);
        uVar61 = vcmpps_avx512vl(auVar85,local_880,0xe);
        uVar67 = uVar67 & uVar61;
        bVar59 = (byte)uVar67;
        if (bVar59 != 0) {
          uVar61 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar72),2);
          auVar236._8_4_ = 0x7f800000;
          auVar236._0_8_ = 0x7f8000007f800000;
          auVar236._12_4_ = 0x7f800000;
          auVar236._16_4_ = 0x7f800000;
          auVar236._20_4_ = 0x7f800000;
          auVar236._24_4_ = 0x7f800000;
          auVar236._28_4_ = 0x7f800000;
          auVar242._8_4_ = 0xff800000;
          auVar242._0_8_ = 0xff800000ff800000;
          auVar242._12_4_ = 0xff800000;
          auVar242._16_4_ = 0xff800000;
          auVar242._20_4_ = 0xff800000;
          auVar242._24_4_ = 0xff800000;
          auVar242._28_4_ = 0xff800000;
          auVar94 = vblendmps_avx512vl(auVar236,auVar242);
          bVar55 = (byte)uVar61;
          uVar68 = (uint)(bVar55 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar85._0_4_;
          bVar64 = (bool)((byte)(uVar61 >> 1) & 1);
          uVar131 = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * auVar85._4_4_;
          bVar64 = (bool)((byte)(uVar61 >> 2) & 1);
          uVar132 = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * auVar85._8_4_;
          bVar64 = (bool)((byte)(uVar61 >> 3) & 1);
          uVar133 = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * auVar85._12_4_;
          bVar64 = (bool)((byte)(uVar61 >> 4) & 1);
          uVar134 = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * auVar85._16_4_;
          bVar64 = (bool)((byte)(uVar61 >> 5) & 1);
          uVar135 = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * auVar85._20_4_;
          bVar64 = (bool)((byte)(uVar61 >> 6) & 1);
          uVar136 = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * auVar85._24_4_;
          bVar64 = SUB81(uVar61 >> 7,0);
          uVar137 = (uint)bVar64 * auVar94._28_4_ | (uint)!bVar64 * auVar85._28_4_;
          auVar125._0_4_ = (bVar59 & 1) * uVar68 | !(bool)(bVar59 & 1) * auVar125._0_4_;
          bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar125._4_4_ = bVar64 * uVar131 | !bVar64 * auVar125._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar125._8_4_ = bVar64 * uVar132 | !bVar64 * auVar125._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar125._12_4_ = bVar64 * uVar133 | !bVar64 * auVar125._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar125._16_4_ = bVar64 * uVar134 | !bVar64 * auVar125._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar125._20_4_ = bVar64 * uVar135 | !bVar64 * auVar125._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar125._24_4_ = bVar64 * uVar136 | !bVar64 * auVar125._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar125._28_4_ = bVar64 * uVar137 | !bVar64 * auVar125._28_4_;
          auVar94 = vblendmps_avx512vl(auVar242,auVar236);
          bVar64 = (bool)((byte)(uVar61 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar61 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar61 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar61 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar61 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar61 >> 6) & 1);
          bVar12 = SUB81(uVar61 >> 7,0);
          auVar126._0_4_ =
               (uint)(bVar59 & 1) *
               ((uint)(bVar55 & 1) * auVar94._0_4_ | !(bool)(bVar55 & 1) * uVar68) |
               !(bool)(bVar59 & 1) * auVar126._0_4_;
          bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar126._4_4_ =
               (uint)bVar6 * ((uint)bVar64 * auVar94._4_4_ | !bVar64 * uVar131) |
               !bVar6 * auVar126._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar126._8_4_ =
               (uint)bVar64 * ((uint)bVar7 * auVar94._8_4_ | !bVar7 * uVar132) |
               !bVar64 * auVar126._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar126._12_4_ =
               (uint)bVar64 * ((uint)bVar8 * auVar94._12_4_ | !bVar8 * uVar133) |
               !bVar64 * auVar126._12_4_;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar126._16_4_ =
               (uint)bVar64 * ((uint)bVar9 * auVar94._16_4_ | !bVar9 * uVar134) |
               !bVar64 * auVar126._16_4_;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar126._20_4_ =
               (uint)bVar64 * ((uint)bVar10 * auVar94._20_4_ | !bVar10 * uVar135) |
               !bVar64 * auVar126._20_4_;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar126._24_4_ =
               (uint)bVar64 * ((uint)bVar11 * auVar94._24_4_ | !bVar11 * uVar136) |
               !bVar64 * auVar126._24_4_;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar126._28_4_ =
               (uint)bVar64 * ((uint)bVar12 * auVar94._28_4_ | !bVar12 * uVar137) |
               !bVar64 * auVar126._28_4_;
          bVar62 = (~bVar59 | bVar55) & bVar62;
        }
      }
      auVar235._0_4_ = (float)local_7e0._0_4_ * auVar152._0_4_;
      auVar235._4_4_ = (float)local_7e0._4_4_ * auVar152._4_4_;
      auVar235._8_4_ = fStack_7d8 * auVar152._8_4_;
      auVar235._12_4_ = fStack_7d4 * auVar152._12_4_;
      auVar235._16_4_ = fStack_7d0 * auVar152._16_4_;
      auVar235._20_4_ = fStack_7cc * auVar152._20_4_;
      auVar235._28_36_ = auVar152._28_36_;
      auVar235._24_4_ = fStack_7c8 * auVar152._24_4_;
      auVar69 = vfmadd231ps_fma(auVar235._0_32_,local_7c0,auVar84);
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_7a0,auVar83);
      auVar234._8_4_ = 0x7fffffff;
      auVar234._0_8_ = 0x7fffffff7fffffff;
      auVar234._12_4_ = 0x7fffffff;
      auVar234._16_4_ = 0x7fffffff;
      auVar234._20_4_ = 0x7fffffff;
      auVar234._24_4_ = 0x7fffffff;
      auVar234._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar69),auVar234);
      _local_440 = local_780;
      auVar230._8_4_ = 0x3e99999a;
      auVar230._0_8_ = 0x3e99999a3e99999a;
      auVar230._12_4_ = 0x3e99999a;
      auVar230._16_4_ = 0x3e99999a;
      auVar230._20_4_ = 0x3e99999a;
      auVar230._24_4_ = 0x3e99999a;
      auVar230._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar94,auVar230,1);
      _local_6a0 = vmaxps_avx(local_780,auVar126);
      auVar94 = vminps_avx(local_600,auVar125);
      uVar17 = vcmpps_avx512vl(local_780,auVar94,2);
      bVar59 = (byte)uVar17 & bVar54;
      uVar16 = vcmpps_avx512vl(_local_6a0,local_600,2);
      if ((bVar54 & ((byte)uVar16 | (byte)uVar17)) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar94);
        auVar226 = ZEXT3264(_DAT_01f7b040);
        auVar238 = ZEXT3264(local_9e0);
        auVar249 = ZEXT3264(local_a00);
        auVar246 = ZEXT3264(local_a20);
        auVar235 = ZEXT3264(local_a40);
        auVar152 = ZEXT3264(local_a60);
        auVar231 = ZEXT3264(local_a80);
        auVar237 = ZEXT3264(local_aa0);
      }
      else {
        bVar55 = (byte)uVar15 | ~bVar62;
        auVar49._4_4_ = (float)local_7e0._4_4_ * auVar239._4_4_;
        auVar49._0_4_ = (float)local_7e0._0_4_ * auVar239._0_4_;
        auVar49._8_4_ = fStack_7d8 * auVar239._8_4_;
        auVar49._12_4_ = fStack_7d4 * auVar239._12_4_;
        auVar49._16_4_ = fStack_7d0 * auVar239._16_4_;
        auVar49._20_4_ = fStack_7cc * auVar239._20_4_;
        auVar49._24_4_ = fStack_7c8 * auVar239._24_4_;
        auVar49._28_4_ = auVar94._28_4_;
        auVar69 = vfmadd213ps_fma(auVar96,local_7c0,auVar49);
        auVar69 = vfmadd213ps_fma(auVar95,local_7a0,ZEXT1632(auVar69));
        auVar94 = vandps_avx(ZEXT1632(auVar69),auVar234);
        uVar15 = vcmpps_avx512vl(auVar94,auVar230,1);
        bVar62 = (byte)uVar15 | ~bVar62;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar147,auVar33);
        local_5e0._0_4_ = (uint)(bVar62 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        local_5e0._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        local_5e0._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        local_5e0._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        local_5e0._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        local_5e0._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        local_5e0._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * 2;
        local_5e0._28_4_ = (uint)(bVar62 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        local_640 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_640,local_5e0,5);
        local_680 = local_780._0_4_ + (float)local_760._0_4_;
        fStack_67c = local_780._4_4_ + (float)local_760._4_4_;
        fStack_678 = local_780._8_4_ + fStack_758;
        fStack_674 = local_780._12_4_ + fStack_754;
        fStack_670 = local_780._16_4_ + fStack_750;
        fStack_66c = local_780._20_4_ + fStack_74c;
        fStack_668 = local_780._24_4_ + fStack_748;
        fStack_664 = local_780._28_4_ + fStack_744;
        _local_620 = _local_6a0;
        for (bVar62 = (byte)uVar15 & bVar59; bVar62 != 0; bVar62 = ~bVar60 & bVar62 & (byte)uVar15)
        {
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar148,local_780);
          auVar128._0_4_ =
               (uint)(bVar62 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 1 & 1);
          auVar128._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 2 & 1);
          auVar128._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 3 & 1);
          auVar128._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 4 & 1);
          auVar128._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 5 & 1);
          auVar128._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 0x7f800000;
          auVar128._24_4_ =
               (uint)(bVar62 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
          auVar94 = vminps_avx(auVar128,auVar94);
          auVar95 = vshufpd_avx(auVar94,auVar94,5);
          auVar94 = vminps_avx(auVar94,auVar95);
          auVar95 = vpermpd_avx2(auVar94,0x4e);
          auVar94 = vminps_avx(auVar94,auVar95);
          uVar15 = vcmpps_avx512vl(auVar128,auVar94,0);
          bVar56 = (byte)uVar15 & bVar62;
          bVar60 = bVar62;
          if (bVar56 != 0) {
            bVar60 = bVar56;
          }
          iVar18 = 0;
          for (uVar68 = (uint)bVar60; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar60 = '\x01' << ((byte)iVar18 & 0x1f);
          uVar68 = *(uint *)(local_520 + (uint)(iVar18 << 2));
          uVar131 = *(uint *)(local_440 + (uint)(iVar18 << 2));
          fVar153 = auVar13._0_4_;
          if ((float)local_9c0._0_4_ < 0.0) {
            auVar248 = ZEXT1664(auVar248._0_16_);
            fVar153 = sqrtf((float)local_9c0._0_4_);
          }
          uVar67 = (ulong)bVar60;
          auVar72 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar69 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar73 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar80 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar73 = vmaxps_avx(auVar69,auVar72);
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar80,auVar198);
          auVar72 = vandps_avx(auVar73,auVar198);
          auVar69 = vmaxps_avx(auVar69,auVar72);
          auVar72 = vmovshdup_avx(auVar69);
          auVar72 = vmaxss_avx(auVar72,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar72);
          fVar166 = auVar69._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar73,auVar73,0xff);
          auVar69 = vinsertps_avx(ZEXT416(uVar131),ZEXT416(uVar68),0x10);
          auVar152 = ZEXT1664(auVar69);
          uVar61 = 0;
          while( true ) {
            bVar56 = (byte)uVar67;
            if (uVar61 == 5) break;
            uVar154 = auVar152._0_4_;
            auVar139._4_4_ = uVar154;
            auVar139._0_4_ = uVar154;
            auVar139._8_4_ = uVar154;
            auVar139._12_4_ = uVar154;
            auVar72 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_9b0);
            auVar73 = auVar152._0_16_;
            auVar69 = vmovshdup_avx(auVar73);
            local_920._0_16_ = auVar69;
            fVar197 = 1.0 - auVar69._0_4_;
            auVar69 = vshufps_avx(auVar73,auVar73,0x55);
            fVar167 = auVar69._0_4_;
            auVar174._0_4_ = local_8e0._0_4_ * fVar167;
            fVar168 = auVar69._4_4_;
            auVar174._4_4_ = local_8e0._4_4_ * fVar168;
            fVar170 = auVar69._8_4_;
            auVar174._8_4_ = local_8e0._8_4_ * fVar170;
            fVar169 = auVar69._12_4_;
            auVar174._12_4_ = local_8e0._12_4_ * fVar169;
            _local_820 = ZEXT416((uint)fVar197);
            auVar199._4_4_ = fVar197;
            auVar199._0_4_ = fVar197;
            auVar199._8_4_ = fVar197;
            auVar199._12_4_ = fVar197;
            auVar69 = vfmadd231ps_fma(auVar174,auVar199,local_8a0._0_16_);
            auVar212._0_4_ = local_8c0._0_4_ * fVar167;
            auVar212._4_4_ = local_8c0._4_4_ * fVar168;
            auVar212._8_4_ = local_8c0._8_4_ * fVar170;
            auVar212._12_4_ = local_8c0._12_4_ * fVar169;
            auVar73 = vfmadd231ps_fma(auVar212,auVar199,local_8e0._0_16_);
            auVar219._0_4_ = fVar167 * (float)local_900._0_4_;
            auVar219._4_4_ = fVar168 * (float)local_900._4_4_;
            auVar219._8_4_ = fVar170 * fStack_8f8;
            auVar219._12_4_ = fVar169 * fStack_8f4;
            auVar80 = vfmadd231ps_fma(auVar219,auVar199,local_8c0._0_16_);
            auVar227._0_4_ = fVar167 * auVar73._0_4_;
            auVar227._4_4_ = fVar168 * auVar73._4_4_;
            auVar227._8_4_ = fVar170 * auVar73._8_4_;
            auVar227._12_4_ = fVar169 * auVar73._12_4_;
            auVar69 = vfmadd231ps_fma(auVar227,auVar199,auVar69);
            auVar175._0_4_ = fVar167 * auVar80._0_4_;
            auVar175._4_4_ = fVar168 * auVar80._4_4_;
            auVar175._8_4_ = fVar170 * auVar80._8_4_;
            auVar175._12_4_ = fVar169 * auVar80._12_4_;
            auVar73 = vfmadd231ps_fma(auVar175,auVar199,auVar73);
            auVar213._0_4_ = fVar167 * auVar73._0_4_;
            auVar213._4_4_ = fVar168 * auVar73._4_4_;
            auVar213._8_4_ = fVar170 * auVar73._8_4_;
            auVar213._12_4_ = fVar169 * auVar73._12_4_;
            auVar80 = vfmadd231ps_fma(auVar213,auVar69,auVar199);
            auVar69 = vsubps_avx(auVar73,auVar69);
            auVar20._8_4_ = 0x40400000;
            auVar20._0_8_ = 0x4040000040400000;
            auVar20._12_4_ = 0x40400000;
            auVar73 = vmulps_avx512vl(auVar69,auVar20);
            local_800._0_16_ = auVar80;
            auVar72 = vsubps_avx(auVar72,auVar80);
            auVar69 = vdpps_avx(auVar72,auVar72,0x7f);
            fVar167 = auVar69._0_4_;
            local_740 = auVar152;
            if (fVar167 < 0.0) {
              auVar238._0_4_ = sqrtf(fVar167);
              auVar238._4_60_ = extraout_var;
              auVar80 = auVar238._0_16_;
              uVar67 = extraout_RAX;
            }
            else {
              auVar80 = vsqrtss_avx(auVar69,auVar69);
            }
            local_840._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
            fVar168 = local_840._0_4_;
            auVar176._4_12_ = ZEXT812(0) << 0x20;
            auVar176._0_4_ = fVar168;
            local_980._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
            fVar170 = local_980._0_4_;
            local_860._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar70 = vxorps_avx512vl(local_840._0_16_,auVar21);
            auVar79 = vfnmadd213ss_fma(local_860._0_16_,local_840._0_16_,ZEXT416(0x40000000));
            local_880._0_4_ = auVar79._0_4_;
            local_9a0._0_4_ = auVar80._0_4_;
            if (fVar168 < auVar70._0_4_) {
              fVar169 = sqrtf(fVar168);
              auVar80 = ZEXT416((uint)local_9a0._0_4_);
              uVar67 = extraout_RAX_00;
            }
            else {
              auVar79 = vsqrtss_avx(local_840._0_16_,local_840._0_16_);
              fVar169 = auVar79._0_4_;
            }
            fVar197 = local_980._0_4_;
            fVar168 = fVar170 * 1.5 + fVar168 * -0.5 * fVar197 * fVar197 * fVar197;
            local_980._0_4_ = auVar73._0_4_ * fVar168;
            local_980._4_4_ = auVar73._4_4_ * fVar168;
            local_980._8_4_ = auVar73._8_4_ * fVar168;
            local_980._12_4_ = auVar73._12_4_ * fVar168;
            auVar79 = vdpps_avx(auVar72,local_980._0_16_,0x7f);
            fVar171 = auVar80._0_4_;
            fVar170 = auVar79._0_4_;
            auVar140._0_4_ = fVar170 * fVar170;
            auVar140._4_4_ = auVar79._4_4_ * auVar79._4_4_;
            auVar140._8_4_ = auVar79._8_4_ * auVar79._8_4_;
            auVar140._12_4_ = auVar79._12_4_ * auVar79._12_4_;
            auVar74 = vsubps_avx512vl(auVar69,auVar140);
            fVar197 = auVar74._0_4_;
            auVar156._4_12_ = ZEXT812(0) << 0x20;
            auVar156._0_4_ = fVar197;
            auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
            auVar75 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
            auVar76 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
            if (fVar197 < 0.0) {
              local_940 = fVar168;
              fStack_93c = fVar168;
              fStack_938 = fVar168;
              fStack_934 = fVar168;
              local_930 = auVar70;
              fVar197 = sqrtf(fVar197);
              auVar76 = ZEXT416(auVar76._0_4_);
              auVar75 = ZEXT416(auVar75._0_4_);
              auVar80 = ZEXT416((uint)local_9a0._0_4_);
              uVar67 = extraout_RAX_01;
              auVar70 = local_930;
              fVar168 = local_940;
              fVar243 = fStack_93c;
              fVar173 = fStack_938;
              fVar244 = fStack_934;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
              fVar197 = auVar74._0_4_;
              fVar243 = fVar168;
              fVar173 = fVar168;
              fVar244 = fVar168;
            }
            auVar248 = ZEXT1664(auVar70);
            auVar218 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_820,local_920._0_16_);
            auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,_local_820);
            fVar172 = auVar74._0_4_ * 6.0;
            fVar14 = local_920._0_4_ * 6.0;
            auVar200._0_4_ = fVar14 * (float)local_900._0_4_;
            auVar200._4_4_ = fVar14 * (float)local_900._4_4_;
            auVar200._8_4_ = fVar14 * fStack_8f8;
            auVar200._12_4_ = fVar14 * fStack_8f4;
            auVar177._4_4_ = fVar172;
            auVar177._0_4_ = fVar172;
            auVar177._8_4_ = fVar172;
            auVar177._12_4_ = fVar172;
            auVar74 = vfmadd132ps_fma(auVar177,auVar200,local_8c0._0_16_);
            fVar172 = auVar218._0_4_ * 6.0;
            auVar157._4_4_ = fVar172;
            auVar157._0_4_ = fVar172;
            auVar157._8_4_ = fVar172;
            auVar157._12_4_ = fVar172;
            auVar74 = vfmadd132ps_fma(auVar157,auVar74,local_8e0._0_16_);
            fVar172 = local_820._0_4_ * 6.0;
            auVar178._4_4_ = fVar172;
            auVar178._0_4_ = fVar172;
            auVar178._8_4_ = fVar172;
            auVar178._12_4_ = fVar172;
            auVar74 = vfmadd132ps_fma(auVar178,auVar74,local_8a0._0_16_);
            auVar158._0_4_ = auVar74._0_4_ * (float)local_840._0_4_;
            auVar158._4_4_ = auVar74._4_4_ * (float)local_840._0_4_;
            auVar158._8_4_ = auVar74._8_4_ * (float)local_840._0_4_;
            auVar158._12_4_ = auVar74._12_4_ * (float)local_840._0_4_;
            auVar74 = vdpps_avx(auVar73,auVar74,0x7f);
            fVar172 = auVar74._0_4_;
            auVar179._0_4_ = auVar73._0_4_ * fVar172;
            auVar179._4_4_ = auVar73._4_4_ * fVar172;
            auVar179._8_4_ = auVar73._8_4_ * fVar172;
            auVar179._12_4_ = auVar73._12_4_ * fVar172;
            auVar74 = vsubps_avx(auVar158,auVar179);
            fVar172 = (float)local_880._0_4_ * (float)local_860._0_4_;
            auVar218 = vmaxss_avx(ZEXT416((uint)fVar166),
                                  ZEXT416((uint)(local_740._0_4_ * fVar153 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar246._16_48_ = local_740._16_48_;
            auVar77 = vxorps_avx512vl(auVar73,auVar22);
            auVar180._0_4_ = fVar168 * auVar74._0_4_ * fVar172;
            auVar180._4_4_ = fVar243 * auVar74._4_4_ * fVar172;
            auVar180._8_4_ = fVar173 * auVar74._8_4_ * fVar172;
            auVar180._12_4_ = fVar244 * auVar74._12_4_ * fVar172;
            auVar74 = vdpps_avx(auVar77,local_980._0_16_,0x7f);
            auVar81 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar166),auVar218);
            auVar80 = vdpps_avx(auVar72,auVar180,0x7f);
            auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar171 + 1.0)),
                                      ZEXT416((uint)(fVar166 / fVar169)),auVar81);
            fVar168 = auVar74._0_4_ + auVar80._0_4_;
            auVar80 = vdpps_avx(local_9b0,local_980._0_16_,0x7f);
            auVar74 = vdpps_avx(auVar72,auVar77,0x7f);
            auVar76 = vmulss_avx512f(auVar76,auVar70);
            auVar78 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar76._0_4_ *
                                                           auVar70._0_4_ * auVar70._0_4_)));
            auVar75 = vdpps_avx(auVar72,local_9b0,0x7f);
            auVar77 = vfnmadd231ss_fma(auVar74,auVar79,ZEXT416((uint)fVar168));
            auVar75 = vfnmadd231ss_fma(auVar75,auVar79,auVar80);
            auVar74 = vpermilps_avx(local_800._0_16_,0xff);
            fVar197 = fVar197 - auVar74._0_4_;
            auVar76 = vshufps_avx(auVar73,auVar73,0xff);
            auVar74 = vfmsub213ss_fma(auVar77,auVar78,auVar76);
            auVar232._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar232._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar232._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar75 = ZEXT416((uint)(auVar75._0_4_ * auVar78._0_4_));
            auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar74._0_4_)),
                                      ZEXT416((uint)fVar168),auVar75);
            auVar74 = vinsertps_avx(auVar232,auVar75,0x1c);
            auVar220._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
            auVar220._8_4_ = auVar80._8_4_ ^ 0x80000000;
            auVar220._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar75 = vinsertps_avx(ZEXT416((uint)fVar168),auVar220,0x10);
            auVar201._0_4_ = auVar77._0_4_;
            auVar201._4_4_ = auVar201._0_4_;
            auVar201._8_4_ = auVar201._0_4_;
            auVar201._12_4_ = auVar201._0_4_;
            auVar80 = vdivps_avx(auVar74,auVar201);
            auVar74 = vdivps_avx(auVar75,auVar201);
            auVar202._0_4_ = fVar170 * auVar80._0_4_ + fVar197 * auVar74._0_4_;
            auVar202._4_4_ = fVar170 * auVar80._4_4_ + fVar197 * auVar74._4_4_;
            auVar202._8_4_ = fVar170 * auVar80._8_4_ + fVar197 * auVar74._8_4_;
            auVar202._12_4_ = fVar170 * auVar80._12_4_ + fVar197 * auVar74._12_4_;
            auVar80 = vsubps_avx(local_740._0_16_,auVar202);
            auVar152 = ZEXT1664(auVar80);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(auVar79,auVar23);
            if (auVar79._0_4_ < auVar81._0_4_) {
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar218._0_4_)),local_950,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(ZEXT416((uint)fVar197),auVar24);
              if (auVar74._0_4_ < auVar79._0_4_) {
                bVar64 = uVar61 < 5;
                fVar153 = auVar80._0_4_ + (float)local_960._0_4_;
                if (fVar153 < fVar1) {
LAB_01a17dbf:
                  bVar56 = 0;
                  goto LAB_01a17dc7;
                }
                fVar166 = *(float *)(ray + k * 4 + 0x200);
                if (fVar153 <= fVar166) {
                  auVar80 = vmovshdup_avx(auVar80);
                  bVar56 = 0;
                  if ((auVar80._0_4_ < 0.0) || (1.0 < auVar80._0_4_)) goto LAB_01a17dc7;
                  auVar203._0_12_ = ZEXT812(0);
                  auVar203._12_4_ = 0;
                  auVar246._0_16_ = auVar203;
                  auVar249._4_60_ = auVar246._4_60_;
                  auVar249._0_4_ = fVar167;
                  auVar80 = vrsqrt14ss_avx512f(auVar203,auVar249._0_16_);
                  fVar167 = auVar80._0_4_;
                  auVar69 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01a17dbf;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar56 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a17dc7;
                  fVar167 = fVar167 * 1.5 + auVar69._0_4_ * fVar167 * fVar167 * fVar167;
                  auVar181._0_4_ = auVar72._0_4_ * fVar167;
                  auVar181._4_4_ = auVar72._4_4_ * fVar167;
                  auVar181._8_4_ = auVar72._8_4_ * fVar167;
                  auVar181._12_4_ = auVar72._12_4_ * fVar167;
                  auVar80 = vfmadd213ps_fma(auVar76,auVar181,auVar73);
                  auVar69 = vshufps_avx(auVar181,auVar181,0xc9);
                  auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar182._0_4_ = auVar181._0_4_ * auVar72._0_4_;
                  auVar182._4_4_ = auVar181._4_4_ * auVar72._4_4_;
                  auVar182._8_4_ = auVar181._8_4_ * auVar72._8_4_;
                  auVar182._12_4_ = auVar181._12_4_ * auVar72._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar182,auVar73,auVar69);
                  auVar69 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar72 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                  auVar141._0_4_ = auVar80._0_4_ * auVar73._0_4_;
                  auVar141._4_4_ = auVar80._4_4_ * auVar73._4_4_;
                  auVar141._8_4_ = auVar80._8_4_ * auVar73._8_4_;
                  auVar141._12_4_ = auVar80._12_4_ * auVar73._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar141,auVar69,auVar72);
                  auVar226 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar226,auVar152);
                  auVar152 = vpermps_avx512f(auVar226,ZEXT1664(auVar69));
                  auVar226 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar226,ZEXT1664(auVar69));
                  local_380 = vbroadcastss_avx512f(auVar69);
                  local_400[0] = (RTCHitN)auVar152[0];
                  local_400[1] = (RTCHitN)auVar152[1];
                  local_400[2] = (RTCHitN)auVar152[2];
                  local_400[3] = (RTCHitN)auVar152[3];
                  local_400[4] = (RTCHitN)auVar152[4];
                  local_400[5] = (RTCHitN)auVar152[5];
                  local_400[6] = (RTCHitN)auVar152[6];
                  local_400[7] = (RTCHitN)auVar152[7];
                  local_400[8] = (RTCHitN)auVar152[8];
                  local_400[9] = (RTCHitN)auVar152[9];
                  local_400[10] = (RTCHitN)auVar152[10];
                  local_400[0xb] = (RTCHitN)auVar152[0xb];
                  local_400[0xc] = (RTCHitN)auVar152[0xc];
                  local_400[0xd] = (RTCHitN)auVar152[0xd];
                  local_400[0xe] = (RTCHitN)auVar152[0xe];
                  local_400[0xf] = (RTCHitN)auVar152[0xf];
                  local_400[0x10] = (RTCHitN)auVar152[0x10];
                  local_400[0x11] = (RTCHitN)auVar152[0x11];
                  local_400[0x12] = (RTCHitN)auVar152[0x12];
                  local_400[0x13] = (RTCHitN)auVar152[0x13];
                  local_400[0x14] = (RTCHitN)auVar152[0x14];
                  local_400[0x15] = (RTCHitN)auVar152[0x15];
                  local_400[0x16] = (RTCHitN)auVar152[0x16];
                  local_400[0x17] = (RTCHitN)auVar152[0x17];
                  local_400[0x18] = (RTCHitN)auVar152[0x18];
                  local_400[0x19] = (RTCHitN)auVar152[0x19];
                  local_400[0x1a] = (RTCHitN)auVar152[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar152[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar152[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar152[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar152[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar152[0x1f];
                  local_400[0x20] = (RTCHitN)auVar152[0x20];
                  local_400[0x21] = (RTCHitN)auVar152[0x21];
                  local_400[0x22] = (RTCHitN)auVar152[0x22];
                  local_400[0x23] = (RTCHitN)auVar152[0x23];
                  local_400[0x24] = (RTCHitN)auVar152[0x24];
                  local_400[0x25] = (RTCHitN)auVar152[0x25];
                  local_400[0x26] = (RTCHitN)auVar152[0x26];
                  local_400[0x27] = (RTCHitN)auVar152[0x27];
                  local_400[0x28] = (RTCHitN)auVar152[0x28];
                  local_400[0x29] = (RTCHitN)auVar152[0x29];
                  local_400[0x2a] = (RTCHitN)auVar152[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar152[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar152[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar152[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar152[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar152[0x2f];
                  local_400[0x30] = (RTCHitN)auVar152[0x30];
                  local_400[0x31] = (RTCHitN)auVar152[0x31];
                  local_400[0x32] = (RTCHitN)auVar152[0x32];
                  local_400[0x33] = (RTCHitN)auVar152[0x33];
                  local_400[0x34] = (RTCHitN)auVar152[0x34];
                  local_400[0x35] = (RTCHitN)auVar152[0x35];
                  local_400[0x36] = (RTCHitN)auVar152[0x36];
                  local_400[0x37] = (RTCHitN)auVar152[0x37];
                  local_400[0x38] = (RTCHitN)auVar152[0x38];
                  local_400[0x39] = (RTCHitN)auVar152[0x39];
                  local_400[0x3a] = (RTCHitN)auVar152[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar152[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar152[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar152[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar152[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar152[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar152 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar152);
                  vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar153;
                  auVar152 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar152);
                  local_ad0.valid = (int *)local_700;
                  local_ad0.geometryUserPtr = pGVar3->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar248 = ZEXT1664(auVar70);
                    (*pGVar3->occlusionFilterN)(&local_ad0);
                    auVar152 = vmovdqa64_avx512f(local_700);
                  }
                  uVar15 = vptestmd_avx512f(auVar152,auVar152);
                  if ((short)uVar15 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      (*p_Var5)(&local_ad0);
                      auVar152 = vmovdqa64_avx512f(local_700);
                    }
                    uVar67 = vptestmd_avx512f(auVar152,auVar152);
                    auVar152 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar6 = (bool)((byte)uVar67 & 1);
                    auVar130._0_4_ =
                         (uint)bVar6 * auVar152._0_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x200);
                    bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar130._4_4_ =
                         (uint)bVar6 * auVar152._4_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x204);
                    bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar130._8_4_ =
                         (uint)bVar6 * auVar152._8_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x208);
                    bVar6 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar130._12_4_ =
                         (uint)bVar6 * auVar152._12_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x20c);
                    bVar6 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar130._16_4_ =
                         (uint)bVar6 * auVar152._16_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x210);
                    bVar6 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar130._20_4_ =
                         (uint)bVar6 * auVar152._20_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x214);
                    bVar6 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar130._24_4_ =
                         (uint)bVar6 * auVar152._24_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x218);
                    bVar6 = (bool)((byte)(uVar67 >> 7) & 1);
                    auVar130._28_4_ =
                         (uint)bVar6 * auVar152._28_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x21c);
                    bVar6 = (bool)((byte)(uVar67 >> 8) & 1);
                    auVar130._32_4_ =
                         (uint)bVar6 * auVar152._32_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x220);
                    bVar6 = (bool)((byte)(uVar67 >> 9) & 1);
                    auVar130._36_4_ =
                         (uint)bVar6 * auVar152._36_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x224);
                    bVar6 = (bool)((byte)(uVar67 >> 10) & 1);
                    auVar130._40_4_ =
                         (uint)bVar6 * auVar152._40_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x228);
                    bVar6 = (bool)((byte)(uVar67 >> 0xb) & 1);
                    auVar130._44_4_ =
                         (uint)bVar6 * auVar152._44_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x22c);
                    bVar6 = (bool)((byte)(uVar67 >> 0xc) & 1);
                    auVar130._48_4_ =
                         (uint)bVar6 * auVar152._48_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x230);
                    bVar6 = (bool)((byte)(uVar67 >> 0xd) & 1);
                    auVar130._52_4_ =
                         (uint)bVar6 * auVar152._52_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x234);
                    bVar6 = (bool)((byte)(uVar67 >> 0xe) & 1);
                    auVar130._56_4_ =
                         (uint)bVar6 * auVar152._56_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x238);
                    bVar6 = SUB81(uVar67 >> 0xf,0);
                    auVar130._60_4_ =
                         (uint)bVar6 * auVar152._60_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_ad0.ray + 0x200) = auVar130;
                    bVar56 = 1;
                    if ((short)uVar67 != 0) goto LAB_01a17dc7;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar166;
                }
                bVar56 = 0;
                goto LAB_01a17dc7;
              }
            }
            uVar61 = uVar61 + 1;
          }
          bVar64 = false;
LAB_01a17dc7:
          bVar57 = bVar57 | bVar64 & bVar56;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar224._4_4_ = uVar154;
          auVar224._0_4_ = uVar154;
          auVar224._8_4_ = uVar154;
          auVar224._12_4_ = uVar154;
          auVar224._16_4_ = uVar154;
          auVar224._20_4_ = uVar154;
          auVar224._24_4_ = uVar154;
          auVar224._28_4_ = uVar154;
          auVar226 = ZEXT3264(auVar224);
          auVar50._4_4_ = fStack_67c;
          auVar50._0_4_ = local_680;
          auVar50._8_4_ = fStack_678;
          auVar50._12_4_ = fStack_674;
          auVar50._16_4_ = fStack_670;
          auVar50._20_4_ = fStack_66c;
          auVar50._24_4_ = fStack_668;
          auVar50._28_4_ = fStack_664;
          uVar15 = vcmpps_avx512vl(auVar224,auVar50,0xd);
        }
        auVar149._0_4_ = (float)local_760._0_4_ + (float)local_6a0._0_4_;
        auVar149._4_4_ = (float)local_760._4_4_ + (float)local_6a0._4_4_;
        auVar149._8_4_ = fStack_758 + fStack_698;
        auVar149._12_4_ = fStack_754 + fStack_694;
        auVar149._16_4_ = fStack_750 + fStack_690;
        auVar149._20_4_ = fStack_74c + fStack_68c;
        auVar149._24_4_ = fStack_748 + fStack_688;
        auVar149._28_4_ = fStack_744 + fStack_684;
        uVar154 = auVar226._0_4_;
        auVar164._4_4_ = uVar154;
        auVar164._0_4_ = uVar154;
        auVar164._8_4_ = uVar154;
        auVar164._12_4_ = uVar154;
        auVar164._16_4_ = uVar154;
        auVar164._20_4_ = uVar154;
        auVar164._24_4_ = uVar154;
        auVar164._28_4_ = uVar154;
        uVar15 = vcmpps_avx512vl(auVar149,auVar164,2);
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar150,auVar34);
        local_6a0._0_4_ = (uint)(bVar55 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar64 = (bool)(bVar55 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar55 >> 2 & 1);
        fStack_698 = (float)((uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar55 >> 3 & 1);
        fStack_694 = (float)((uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar55 >> 4 & 1);
        fStack_690 = (float)((uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar55 >> 5 & 1);
        fStack_68c = (float)((uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar55 >> 6 & 1);
        fStack_688 = (float)((uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * 2);
        fStack_684 = (float)((uint)(bVar55 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2);
        bVar54 = (byte)uVar16 & bVar54 & (byte)uVar15;
        uVar15 = vpcmpd_avx512vl(_local_6a0,local_640,2);
        local_780 = _local_620;
        local_680 = (float)local_760._0_4_ + (float)local_620._0_4_;
        fStack_67c = (float)local_760._4_4_ + (float)local_620._4_4_;
        fStack_678 = fStack_758 + fStack_618;
        fStack_674 = fStack_754 + fStack_614;
        fStack_670 = fStack_750 + fStack_610;
        fStack_66c = fStack_74c + fStack_60c;
        fStack_668 = fStack_748 + fStack_608;
        fStack_664 = fStack_744 + fStack_604;
        auVar238 = ZEXT3264(local_9e0);
        auVar249 = ZEXT3264(local_a00);
        auVar246 = ZEXT3264(local_a20);
        auVar235 = ZEXT3264(local_a40);
        auVar152 = ZEXT3264(local_a60);
        auVar231 = ZEXT3264(local_a80);
        auVar237 = ZEXT3264(local_aa0);
        for (bVar62 = (byte)uVar15 & bVar54; bVar62 != 0; bVar62 = ~bVar55 & bVar62 & (byte)uVar15)
        {
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar151,local_780);
          auVar129._0_4_ =
               (uint)(bVar62 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)(bVar62 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * 0x7f800000;
          auVar129._24_4_ =
               (uint)(bVar62 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar94 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar94 = vminps_avx(auVar129,auVar94);
          auVar95 = vshufpd_avx(auVar94,auVar94,5);
          auVar94 = vminps_avx(auVar94,auVar95);
          auVar95 = vpermpd_avx2(auVar94,0x4e);
          auVar94 = vminps_avx(auVar94,auVar95);
          uVar15 = vcmpps_avx512vl(auVar129,auVar94,0);
          bVar60 = (byte)uVar15 & bVar62;
          bVar55 = bVar62;
          if (bVar60 != 0) {
            bVar55 = bVar60;
          }
          iVar18 = 0;
          for (uVar68 = (uint)bVar55; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar55 = '\x01' << ((byte)iVar18 & 0x1f);
          uVar68 = *(uint *)(local_540 + (uint)(iVar18 << 2));
          uVar131 = *(uint *)(local_600 + (uint)(iVar18 << 2));
          fVar153 = auVar71._0_4_;
          if ((float)local_9c0._0_4_ < 0.0) {
            auVar248 = ZEXT1664(auVar248._0_16_);
            fVar153 = sqrtf((float)local_9c0._0_4_);
            auVar237 = ZEXT3264(local_aa0);
            auVar231 = ZEXT3264(local_a80);
            auVar152 = ZEXT3264(local_a60);
            auVar235 = ZEXT3264(local_a40);
            auVar246 = ZEXT3264(local_a20);
            auVar249 = ZEXT3264(local_a00);
            auVar238 = ZEXT3264(local_9e0);
          }
          uVar67 = (ulong)bVar55;
          auVar72 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar69 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar73 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar80 = vminps_avx(auVar72,auVar73);
          auVar72 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
          auVar73 = vmaxps_avx(auVar69,auVar72);
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar80,auVar204);
          auVar72 = vandps_avx(auVar73,auVar204);
          auVar69 = vmaxps_avx(auVar69,auVar72);
          auVar72 = vmovshdup_avx(auVar69);
          auVar72 = vmaxss_avx(auVar72,auVar69);
          auVar69 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxss_avx(auVar69,auVar72);
          fVar166 = auVar69._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar73,auVar73,0xff);
          auVar69 = vinsertps_avx(ZEXT416(uVar131),ZEXT416(uVar68),0x10);
          auVar226 = ZEXT1664(auVar69);
          uVar61 = 0;
          while( true ) {
            bVar60 = (byte)uVar67;
            if (uVar61 == 5) break;
            uVar154 = auVar226._0_4_;
            auVar142._4_4_ = uVar154;
            auVar142._0_4_ = uVar154;
            auVar142._8_4_ = uVar154;
            auVar142._12_4_ = uVar154;
            auVar72 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_9b0);
            auVar73 = auVar226._0_16_;
            auVar69 = vmovshdup_avx(auVar73);
            local_840._0_16_ = auVar69;
            fVar197 = 1.0 - auVar69._0_4_;
            auVar69 = vshufps_avx(auVar73,auVar73,0x55);
            fVar167 = auVar69._0_4_;
            auVar183._0_4_ = local_8e0._0_4_ * fVar167;
            fVar168 = auVar69._4_4_;
            auVar183._4_4_ = local_8e0._4_4_ * fVar168;
            fVar170 = auVar69._8_4_;
            auVar183._8_4_ = local_8e0._8_4_ * fVar170;
            fVar169 = auVar69._12_4_;
            auVar183._12_4_ = local_8e0._12_4_ * fVar169;
            _local_820 = ZEXT416((uint)fVar197);
            auVar205._4_4_ = fVar197;
            auVar205._0_4_ = fVar197;
            auVar205._8_4_ = fVar197;
            auVar205._12_4_ = fVar197;
            auVar69 = vfmadd231ps_fma(auVar183,auVar205,local_8a0._0_16_);
            auVar214._0_4_ = local_8c0._0_4_ * fVar167;
            auVar214._4_4_ = local_8c0._4_4_ * fVar168;
            auVar214._8_4_ = local_8c0._8_4_ * fVar170;
            auVar214._12_4_ = local_8c0._12_4_ * fVar169;
            auVar73 = vfmadd231ps_fma(auVar214,auVar205,local_8e0._0_16_);
            auVar221._0_4_ = fVar167 * (float)local_900._0_4_;
            auVar221._4_4_ = fVar168 * (float)local_900._4_4_;
            auVar221._8_4_ = fVar170 * fStack_8f8;
            auVar221._12_4_ = fVar169 * fStack_8f4;
            auVar80 = vfmadd231ps_fma(auVar221,auVar205,local_8c0._0_16_);
            auVar228._0_4_ = fVar167 * auVar73._0_4_;
            auVar228._4_4_ = fVar168 * auVar73._4_4_;
            auVar228._8_4_ = fVar170 * auVar73._8_4_;
            auVar228._12_4_ = fVar169 * auVar73._12_4_;
            auVar69 = vfmadd231ps_fma(auVar228,auVar205,auVar69);
            auVar184._0_4_ = fVar167 * auVar80._0_4_;
            auVar184._4_4_ = fVar168 * auVar80._4_4_;
            auVar184._8_4_ = fVar170 * auVar80._8_4_;
            auVar184._12_4_ = fVar169 * auVar80._12_4_;
            auVar73 = vfmadd231ps_fma(auVar184,auVar205,auVar73);
            auVar215._0_4_ = fVar167 * auVar73._0_4_;
            auVar215._4_4_ = fVar168 * auVar73._4_4_;
            auVar215._8_4_ = fVar170 * auVar73._8_4_;
            auVar215._12_4_ = fVar169 * auVar73._12_4_;
            auVar80 = vfmadd231ps_fma(auVar215,auVar69,auVar205);
            auVar69 = vsubps_avx(auVar73,auVar69);
            auVar25._8_4_ = 0x40400000;
            auVar25._0_8_ = 0x4040000040400000;
            auVar25._12_4_ = 0x40400000;
            auVar73 = vmulps_avx512vl(auVar69,auVar25);
            local_800._0_16_ = auVar80;
            auVar72 = vsubps_avx(auVar72,auVar80);
            auVar69 = vdpps_avx(auVar72,auVar72,0x7f);
            fVar167 = auVar69._0_4_;
            local_740 = auVar226;
            if (fVar167 < 0.0) {
              auVar237._0_4_ = sqrtf(fVar167);
              auVar237._4_60_ = extraout_var_00;
              auVar80 = auVar237._0_16_;
              uVar67 = extraout_RAX_02;
            }
            else {
              auVar80 = vsqrtss_avx(auVar69,auVar69);
            }
            local_860._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
            fVar168 = local_860._0_4_;
            auVar185._4_12_ = ZEXT812(0) << 0x20;
            auVar185._0_4_ = fVar168;
            local_9a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
            fVar170 = local_9a0._0_4_;
            local_880._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar70 = vxorps_avx512vl(local_860._0_16_,auVar26);
            auVar79 = vfnmadd213ss_fma(local_880._0_16_,local_860._0_16_,ZEXT416(0x40000000));
            local_980._0_4_ = auVar79._0_4_;
            local_920._0_4_ = auVar80._0_4_;
            if (fVar168 < auVar70._0_4_) {
              fVar169 = sqrtf(fVar168);
              auVar80 = ZEXT416((uint)local_920._0_4_);
              uVar67 = extraout_RAX_03;
            }
            else {
              auVar79 = vsqrtss_avx(local_860._0_16_,local_860._0_16_);
              fVar169 = auVar79._0_4_;
            }
            fVar197 = local_9a0._0_4_;
            fVar168 = fVar170 * 1.5 + fVar168 * -0.5 * fVar197 * fVar197 * fVar197;
            auVar143._0_4_ = auVar73._0_4_ * fVar168;
            auVar143._4_4_ = auVar73._4_4_ * fVar168;
            auVar143._8_4_ = auVar73._8_4_ * fVar168;
            auVar143._12_4_ = auVar73._12_4_ * fVar168;
            local_9a0._0_16_ = vdpps_avx(auVar72,auVar143,0x7f);
            auVar70 = vaddss_avx512f(auVar80,ZEXT416(0x3f800000));
            auVar144._0_4_ = local_9a0._0_4_ * local_9a0._0_4_;
            auVar144._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
            auVar144._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
            auVar144._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
            auVar69 = vsubps_avx(auVar69,auVar144);
            fVar170 = auVar69._0_4_;
            auVar159._4_12_ = ZEXT812(0) << 0x20;
            auVar159._0_4_ = fVar170;
            auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
            auVar74 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
            auVar75 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
            uVar66 = fVar170 == 0.0;
            uVar65 = fVar170 < 0.0;
            if ((bool)uVar65) {
              local_940 = fVar168;
              fStack_93c = fVar168;
              fStack_938 = fVar168;
              fStack_934 = fVar168;
              local_930 = auVar79;
              fVar170 = sqrtf(fVar170);
              auVar75 = ZEXT416(auVar75._0_4_);
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar80 = ZEXT416((uint)local_920._0_4_);
              auVar70 = ZEXT416(auVar70._0_4_);
              uVar67 = extraout_RAX_04;
              auVar79 = local_930;
              fVar168 = local_940;
              fVar197 = fStack_93c;
              fVar171 = fStack_938;
              fVar243 = fStack_934;
            }
            else {
              auVar69 = vsqrtss_avx(auVar69,auVar69);
              fVar170 = auVar69._0_4_;
              fVar197 = fVar168;
              fVar171 = fVar168;
              fVar243 = fVar168;
            }
            auVar248 = ZEXT1664(auVar72);
            auVar238 = ZEXT3264(local_9e0);
            auVar249 = ZEXT3264(local_a00);
            auVar246 = ZEXT3264(local_a20);
            auVar152 = ZEXT3264(local_a60);
            auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_820,local_840._0_16_);
            auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,_local_820);
            fVar173 = auVar69._0_4_ * 6.0;
            fVar244 = local_840._0_4_ * 6.0;
            auVar206._0_4_ = fVar244 * (float)local_900._0_4_;
            auVar206._4_4_ = fVar244 * (float)local_900._4_4_;
            auVar206._8_4_ = fVar244 * fStack_8f8;
            auVar206._12_4_ = fVar244 * fStack_8f4;
            auVar186._4_4_ = fVar173;
            auVar186._0_4_ = fVar173;
            auVar186._8_4_ = fVar173;
            auVar186._12_4_ = fVar173;
            auVar69 = vfmadd132ps_fma(auVar186,auVar206,local_8c0._0_16_);
            fVar173 = auVar76._0_4_ * 6.0;
            auVar160._4_4_ = fVar173;
            auVar160._0_4_ = fVar173;
            auVar160._8_4_ = fVar173;
            auVar160._12_4_ = fVar173;
            auVar69 = vfmadd132ps_fma(auVar160,auVar69,local_8e0._0_16_);
            fVar173 = local_820._0_4_ * 6.0;
            auVar187._4_4_ = fVar173;
            auVar187._0_4_ = fVar173;
            auVar187._8_4_ = fVar173;
            auVar187._12_4_ = fVar173;
            auVar69 = vfmadd132ps_fma(auVar187,auVar69,local_8a0._0_16_);
            auVar161._0_4_ = auVar69._0_4_ * (float)local_860._0_4_;
            auVar161._4_4_ = auVar69._4_4_ * (float)local_860._0_4_;
            auVar161._8_4_ = auVar69._8_4_ * (float)local_860._0_4_;
            auVar161._12_4_ = auVar69._12_4_ * (float)local_860._0_4_;
            auVar69 = vdpps_avx(auVar73,auVar69,0x7f);
            fVar173 = auVar69._0_4_;
            auVar188._0_4_ = auVar73._0_4_ * fVar173;
            auVar188._4_4_ = auVar73._4_4_ * fVar173;
            auVar188._8_4_ = auVar73._8_4_ * fVar173;
            auVar188._12_4_ = auVar73._12_4_ * fVar173;
            auVar69 = vsubps_avx(auVar161,auVar188);
            fVar173 = (float)local_980._0_4_ * (float)local_880._0_4_;
            auVar76 = vmaxss_avx(ZEXT416((uint)fVar166),
                                 ZEXT416((uint)(local_740._0_4_ * fVar153 * 1.9073486e-06)));
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar81 = vxorps_avx512vl(auVar73,auVar27);
            auVar189._0_4_ = fVar168 * auVar69._0_4_ * fVar173;
            auVar189._4_4_ = fVar197 * auVar69._4_4_ * fVar173;
            auVar189._8_4_ = fVar171 * auVar69._8_4_ * fVar173;
            auVar189._12_4_ = fVar243 * auVar69._12_4_ * fVar173;
            auVar69 = vdpps_avx(auVar81,auVar143,0x7f);
            auVar218 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar166),auVar76);
            auVar80 = vdpps_avx(auVar72,auVar189,0x7f);
            vfmadd213ss_avx512f(auVar70,ZEXT416((uint)(fVar166 / fVar169)),auVar218);
            fVar168 = auVar69._0_4_ + auVar80._0_4_;
            auVar69 = vdpps_avx(local_9b0,auVar143,0x7f);
            auVar80 = vdpps_avx(auVar72,auVar81,0x7f);
            auVar70 = vmulss_avx512f(auVar75,auVar79);
            auVar79 = vmulss_avx512f(auVar79,auVar79);
            auVar74 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar70._0_4_ * auVar79._0_4_)));
            auVar79 = vdpps_avx(auVar72,local_9b0,0x7f);
            auVar75 = vfnmadd231ss_avx512f(auVar80,local_9a0._0_16_,ZEXT416((uint)fVar168));
            auVar79 = vfnmadd231ss_avx512f(auVar79,local_9a0._0_16_,auVar69);
            auVar80 = vpermilps_avx(local_800._0_16_,0xff);
            fVar170 = fVar170 - auVar80._0_4_;
            auVar70 = vshufps_avx(auVar73,auVar73,0xff);
            auVar80 = vfmsub213ss_fma(auVar75,auVar74,auVar70);
            auVar233._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
            auVar233._8_4_ = auVar80._8_4_ ^ 0x80000000;
            auVar233._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar74._0_4_));
            auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar80._0_4_)),
                                      ZEXT416((uint)fVar168),auVar79);
            auVar80 = vinsertps_avx(auVar233,auVar79,0x1c);
            auVar222._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
            auVar222._8_4_ = auVar69._8_4_ ^ 0x80000000;
            auVar222._12_4_ = auVar69._12_4_ ^ 0x80000000;
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar168),auVar222,0x10);
            auVar207._0_4_ = auVar74._0_4_;
            auVar207._4_4_ = auVar207._0_4_;
            auVar207._8_4_ = auVar207._0_4_;
            auVar207._12_4_ = auVar207._0_4_;
            auVar69 = vdivps_avx(auVar80,auVar207);
            auVar80 = vdivps_avx(auVar79,auVar207);
            auVar79 = vbroadcastss_avx512vl(local_9a0._0_16_);
            auVar208._0_4_ = auVar79._0_4_ * auVar69._0_4_ + fVar170 * auVar80._0_4_;
            auVar208._4_4_ = auVar79._4_4_ * auVar69._4_4_ + fVar170 * auVar80._4_4_;
            auVar208._8_4_ = auVar79._8_4_ * auVar69._8_4_ + fVar170 * auVar80._8_4_;
            auVar208._12_4_ = auVar79._12_4_ * auVar69._12_4_ + fVar170 * auVar80._12_4_;
            auVar69 = vsubps_avx(local_740._0_16_,auVar208);
            auVar226 = ZEXT1664(auVar69);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar80 = vandps_avx512vl(local_9a0._0_16_,auVar28);
            auVar80 = vucomiss_avx512f(auVar80);
            if (!(bool)uVar65 && !(bool)uVar66) {
              auVar80 = vaddss_avx512f(auVar76,auVar80);
              auVar80 = vfmadd231ss_fma(auVar80,local_950,ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar29);
              if (auVar79._0_4_ < auVar80._0_4_) {
                bVar64 = uVar61 < 5;
                fVar153 = auVar69._0_4_ + (float)local_960._0_4_;
                auVar235 = ZEXT3264(local_a40);
                auVar231 = ZEXT3264(local_a80);
                auVar237 = ZEXT3264(local_aa0);
                if (fVar153 < fVar1) {
LAB_01a189a0:
                  bVar60 = 0;
                  goto LAB_01a189a8;
                }
                fVar166 = *(float *)(ray + k * 4 + 0x200);
                if (fVar153 <= fVar166) {
                  auVar69 = vmovshdup_avx(auVar69);
                  bVar60 = 0;
                  if ((auVar69._0_4_ < 0.0) || (1.0 < auVar69._0_4_)) goto LAB_01a189a8;
                  auVar209._0_12_ = ZEXT812(0);
                  auVar209._12_4_ = 0;
                  auVar190._4_8_ = auVar209._4_8_;
                  auVar190._0_4_ = fVar167;
                  auVar190._12_4_ = 0;
                  auVar69 = vrsqrt14ss_avx512f(auVar209,auVar190);
                  fVar168 = auVar69._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01a189a0;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar60 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a189a8;
                  fVar167 = fVar168 * 1.5 + fVar167 * -0.5 * fVar168 * fVar168 * fVar168;
                  auVar191._0_4_ = auVar72._0_4_ * fVar167;
                  auVar191._4_4_ = auVar72._4_4_ * fVar167;
                  auVar191._8_4_ = auVar72._8_4_ * fVar167;
                  auVar191._12_4_ = auVar72._12_4_ * fVar167;
                  auVar79 = vfmadd213ps_fma(auVar70,auVar191,auVar73);
                  auVar69 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar80 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar192._0_4_ = auVar191._0_4_ * auVar80._0_4_;
                  auVar192._4_4_ = auVar191._4_4_ * auVar80._4_4_;
                  auVar192._8_4_ = auVar191._8_4_ * auVar80._8_4_;
                  auVar192._12_4_ = auVar191._12_4_ * auVar80._12_4_;
                  auVar80 = vfmsub231ps_fma(auVar192,auVar73,auVar69);
                  auVar69 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar73 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                  auVar145._0_4_ = auVar79._0_4_ * auVar80._0_4_;
                  auVar145._4_4_ = auVar79._4_4_ * auVar80._4_4_;
                  auVar145._8_4_ = auVar79._8_4_ * auVar80._8_4_;
                  auVar145._12_4_ = auVar79._12_4_ * auVar80._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar145,auVar69,auVar73);
                  auVar251 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar251,auVar226);
                  auVar226 = vpermps_avx512f(auVar251,ZEXT1664(auVar69));
                  auVar251 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar251,ZEXT1664(auVar69));
                  local_380 = vbroadcastss_avx512f(auVar69);
                  local_400[0] = (RTCHitN)auVar226[0];
                  local_400[1] = (RTCHitN)auVar226[1];
                  local_400[2] = (RTCHitN)auVar226[2];
                  local_400[3] = (RTCHitN)auVar226[3];
                  local_400[4] = (RTCHitN)auVar226[4];
                  local_400[5] = (RTCHitN)auVar226[5];
                  local_400[6] = (RTCHitN)auVar226[6];
                  local_400[7] = (RTCHitN)auVar226[7];
                  local_400[8] = (RTCHitN)auVar226[8];
                  local_400[9] = (RTCHitN)auVar226[9];
                  local_400[10] = (RTCHitN)auVar226[10];
                  local_400[0xb] = (RTCHitN)auVar226[0xb];
                  local_400[0xc] = (RTCHitN)auVar226[0xc];
                  local_400[0xd] = (RTCHitN)auVar226[0xd];
                  local_400[0xe] = (RTCHitN)auVar226[0xe];
                  local_400[0xf] = (RTCHitN)auVar226[0xf];
                  local_400[0x10] = (RTCHitN)auVar226[0x10];
                  local_400[0x11] = (RTCHitN)auVar226[0x11];
                  local_400[0x12] = (RTCHitN)auVar226[0x12];
                  local_400[0x13] = (RTCHitN)auVar226[0x13];
                  local_400[0x14] = (RTCHitN)auVar226[0x14];
                  local_400[0x15] = (RTCHitN)auVar226[0x15];
                  local_400[0x16] = (RTCHitN)auVar226[0x16];
                  local_400[0x17] = (RTCHitN)auVar226[0x17];
                  local_400[0x18] = (RTCHitN)auVar226[0x18];
                  local_400[0x19] = (RTCHitN)auVar226[0x19];
                  local_400[0x1a] = (RTCHitN)auVar226[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar226[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar226[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar226[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar226[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar226[0x1f];
                  local_400[0x20] = (RTCHitN)auVar226[0x20];
                  local_400[0x21] = (RTCHitN)auVar226[0x21];
                  local_400[0x22] = (RTCHitN)auVar226[0x22];
                  local_400[0x23] = (RTCHitN)auVar226[0x23];
                  local_400[0x24] = (RTCHitN)auVar226[0x24];
                  local_400[0x25] = (RTCHitN)auVar226[0x25];
                  local_400[0x26] = (RTCHitN)auVar226[0x26];
                  local_400[0x27] = (RTCHitN)auVar226[0x27];
                  local_400[0x28] = (RTCHitN)auVar226[0x28];
                  local_400[0x29] = (RTCHitN)auVar226[0x29];
                  local_400[0x2a] = (RTCHitN)auVar226[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar226[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar226[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar226[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar226[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar226[0x2f];
                  local_400[0x30] = (RTCHitN)auVar226[0x30];
                  local_400[0x31] = (RTCHitN)auVar226[0x31];
                  local_400[0x32] = (RTCHitN)auVar226[0x32];
                  local_400[0x33] = (RTCHitN)auVar226[0x33];
                  local_400[0x34] = (RTCHitN)auVar226[0x34];
                  local_400[0x35] = (RTCHitN)auVar226[0x35];
                  local_400[0x36] = (RTCHitN)auVar226[0x36];
                  local_400[0x37] = (RTCHitN)auVar226[0x37];
                  local_400[0x38] = (RTCHitN)auVar226[0x38];
                  local_400[0x39] = (RTCHitN)auVar226[0x39];
                  local_400[0x3a] = (RTCHitN)auVar226[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar226[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar226[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar226[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar226[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar226[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar226 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar226);
                  vpcmpeqd_avx2(auVar226._0_32_,auVar226._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar153;
                  auVar226 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar226);
                  local_ad0.valid = (int *)local_700;
                  local_ad0.geometryUserPtr = pGVar3->userPtr;
                  local_ad0.context = context->user;
                  local_ad0.hit = local_400;
                  local_ad0.N = 0x10;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar248 = ZEXT1664(auVar72);
                    (*pGVar3->occlusionFilterN)(&local_ad0);
                    auVar237 = ZEXT3264(local_aa0);
                    auVar231 = ZEXT3264(local_a80);
                    auVar152 = ZEXT3264(local_a60);
                    auVar235 = ZEXT3264(local_a40);
                    auVar246 = ZEXT3264(local_a20);
                    auVar249 = ZEXT3264(local_a00);
                    auVar238 = ZEXT3264(local_9e0);
                    auVar226 = vmovdqa64_avx512f(local_700);
                  }
                  uVar15 = vptestmd_avx512f(auVar226,auVar226);
                  if ((short)uVar15 != 0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      (*p_Var5)(&local_ad0);
                      auVar237 = ZEXT3264(local_aa0);
                      auVar231 = ZEXT3264(local_a80);
                      auVar152 = ZEXT3264(local_a60);
                      auVar235 = ZEXT3264(local_a40);
                      auVar246 = ZEXT3264(local_a20);
                      auVar249 = ZEXT3264(local_a00);
                      auVar238 = ZEXT3264(local_9e0);
                      auVar226 = vmovdqa64_avx512f(local_700);
                    }
                    uVar67 = vptestmd_avx512f(auVar226,auVar226);
                    auVar226 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar6 = (bool)((byte)uVar67 & 1);
                    auVar251._0_4_ =
                         (uint)bVar6 * auVar226._0_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x200);
                    bVar6 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar251._4_4_ =
                         (uint)bVar6 * auVar226._4_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x204);
                    bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar251._8_4_ =
                         (uint)bVar6 * auVar226._8_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x208);
                    bVar6 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar251._12_4_ =
                         (uint)bVar6 * auVar226._12_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x20c);
                    bVar6 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar251._16_4_ =
                         (uint)bVar6 * auVar226._16_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x210);
                    bVar6 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar251._20_4_ =
                         (uint)bVar6 * auVar226._20_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x214);
                    bVar6 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar251._24_4_ =
                         (uint)bVar6 * auVar226._24_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x218);
                    bVar6 = (bool)((byte)(uVar67 >> 7) & 1);
                    auVar251._28_4_ =
                         (uint)bVar6 * auVar226._28_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x21c);
                    bVar6 = (bool)((byte)(uVar67 >> 8) & 1);
                    auVar251._32_4_ =
                         (uint)bVar6 * auVar226._32_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x220);
                    bVar6 = (bool)((byte)(uVar67 >> 9) & 1);
                    auVar251._36_4_ =
                         (uint)bVar6 * auVar226._36_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x224);
                    bVar6 = (bool)((byte)(uVar67 >> 10) & 1);
                    auVar251._40_4_ =
                         (uint)bVar6 * auVar226._40_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x228);
                    bVar6 = (bool)((byte)(uVar67 >> 0xb) & 1);
                    auVar251._44_4_ =
                         (uint)bVar6 * auVar226._44_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x22c);
                    bVar6 = (bool)((byte)(uVar67 >> 0xc) & 1);
                    auVar251._48_4_ =
                         (uint)bVar6 * auVar226._48_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x230);
                    bVar6 = (bool)((byte)(uVar67 >> 0xd) & 1);
                    auVar251._52_4_ =
                         (uint)bVar6 * auVar226._52_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x234);
                    bVar6 = (bool)((byte)(uVar67 >> 0xe) & 1);
                    auVar251._56_4_ =
                         (uint)bVar6 * auVar226._56_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x238);
                    bVar6 = SUB81(uVar67 >> 0xf,0);
                    auVar251._60_4_ =
                         (uint)bVar6 * auVar226._60_4_ |
                         (uint)!bVar6 * *(int *)(local_ad0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_ad0.ray + 0x200) = auVar251;
                    bVar60 = 1;
                    if ((short)uVar67 != 0) goto LAB_01a189a8;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar166;
                }
                bVar60 = 0;
                goto LAB_01a189a8;
              }
            }
            uVar61 = uVar61 + 1;
            auVar235 = ZEXT3264(local_a40);
            auVar231 = ZEXT3264(local_a80);
            auVar237 = ZEXT3264(local_aa0);
          }
          bVar64 = false;
LAB_01a189a8:
          bVar57 = bVar57 | bVar64 & bVar60;
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar225._4_4_ = uVar154;
          auVar225._0_4_ = uVar154;
          auVar225._8_4_ = uVar154;
          auVar225._12_4_ = uVar154;
          auVar225._16_4_ = uVar154;
          auVar225._20_4_ = uVar154;
          auVar225._24_4_ = uVar154;
          auVar225._28_4_ = uVar154;
          auVar226 = ZEXT3264(auVar225);
          auVar51._4_4_ = fStack_67c;
          auVar51._0_4_ = local_680;
          auVar51._8_4_ = fStack_678;
          auVar51._12_4_ = fStack_674;
          auVar51._16_4_ = fStack_670;
          auVar51._20_4_ = fStack_66c;
          auVar51._24_4_ = fStack_668;
          auVar51._28_4_ = fStack_664;
          uVar15 = vcmpps_avx512vl(auVar225,auVar51,0xd);
        }
        uVar17 = vpcmpd_avx512vl(local_640,local_5e0,1);
        uVar16 = vpcmpd_avx512vl(local_640,_local_6a0,1);
        auVar165._0_4_ = (float)local_760._0_4_ + (float)local_440._0_4_;
        auVar165._4_4_ = (float)local_760._4_4_ + (float)local_440._4_4_;
        auVar165._8_4_ = fStack_758 + fStack_438;
        auVar165._12_4_ = fStack_754 + fStack_434;
        auVar165._16_4_ = fStack_750 + fStack_430;
        auVar165._20_4_ = fStack_74c + fStack_42c;
        auVar165._24_4_ = fStack_748 + fStack_428;
        auVar165._28_4_ = fStack_744 + fStack_424;
        uVar154 = auVar226._0_4_;
        auVar196._4_4_ = uVar154;
        auVar196._0_4_ = uVar154;
        auVar196._8_4_ = uVar154;
        auVar196._12_4_ = uVar154;
        auVar196._16_4_ = uVar154;
        auVar196._20_4_ = uVar154;
        auVar196._24_4_ = uVar154;
        auVar196._28_4_ = uVar154;
        uVar15 = vcmpps_avx512vl(auVar165,auVar196,2);
        bVar59 = bVar59 & (byte)uVar17 & (byte)uVar15;
        auVar211._0_4_ = (float)local_760._0_4_ + (float)local_620._0_4_;
        auVar211._4_4_ = (float)local_760._4_4_ + (float)local_620._4_4_;
        auVar211._8_4_ = fStack_758 + fStack_618;
        auVar211._12_4_ = fStack_754 + fStack_614;
        auVar211._16_4_ = fStack_750 + fStack_610;
        auVar211._20_4_ = fStack_74c + fStack_60c;
        auVar211._24_4_ = fStack_748 + fStack_608;
        auVar211._28_4_ = fStack_744 + fStack_604;
        uVar15 = vcmpps_avx512vl(auVar211,auVar196,2);
        bVar54 = bVar54 & (byte)uVar16 & (byte)uVar15 | bVar59;
        if (bVar54 != 0) {
          abStack_1a0[uVar58 * 0x60] = bVar54;
          bVar64 = (bool)(bVar59 >> 1 & 1);
          bVar6 = (bool)(bVar59 >> 2 & 1);
          bVar7 = (bool)(bVar59 >> 3 & 1);
          bVar8 = (bool)(bVar59 >> 4 & 1);
          bVar9 = (bool)(bVar59 >> 5 & 1);
          auStack_180[uVar58 * 0x18] =
               (uint)(bVar59 & 1) * local_440._0_4_ | (uint)!(bool)(bVar59 & 1) * local_620._0_4_;
          auStack_180[uVar58 * 0x18 + 1] =
               (uint)bVar64 * local_440._4_4_ | (uint)!bVar64 * local_620._4_4_;
          auStack_180[uVar58 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_438 | (uint)!bVar6 * (int)fStack_618;
          auStack_180[uVar58 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_434 | (uint)!bVar7 * (int)fStack_614;
          auStack_180[uVar58 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_430 | (uint)!bVar8 * (int)fStack_610;
          auStack_180[uVar58 * 0x18 + 5] =
               (uint)bVar9 * (int)fStack_42c | (uint)!bVar9 * (int)fStack_60c;
          auStack_180[uVar58 * 0x18 + 6] =
               (uint)(bVar59 >> 6) * (int)fStack_428 | (uint)!(bool)(bVar59 >> 6) * (int)fStack_608;
          (&fStack_164)[uVar58 * 0x18] = fStack_604;
          uVar67 = vmovlps_avx(local_650);
          (&uStack_160)[uVar58 * 0xc] = uVar67;
          aiStack_158[uVar58 * 0x18] = local_cd4 + 1;
          uVar58 = (ulong)((int)uVar58 + 1);
        }
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar251 = ZEXT3264(auVar94);
        auVar226 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar68 = (uint)uVar58;
      uVar58 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar57 != 0) goto LAB_01a18f89;
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar154;
        auVar36._0_4_ = uVar154;
        auVar36._8_4_ = uVar154;
        auVar36._12_4_ = uVar154;
        auVar36._16_4_ = uVar154;
        auVar36._20_4_ = uVar154;
        auVar36._24_4_ = uVar154;
        auVar36._28_4_ = uVar154;
        uVar15 = vcmpps_avx512vl(local_5c0,auVar36,2);
        uVar63 = (ulong)((uint)uVar15 & (uint)uVar63 - 1 & (uint)uVar63);
        goto LAB_01a16722;
      }
      auVar94 = *(undefined1 (*) [32])(auStack_180 + uVar58 * 0x18);
      auVar162._0_4_ = auVar94._0_4_ + (float)local_760._0_4_;
      auVar162._4_4_ = auVar94._4_4_ + (float)local_760._4_4_;
      auVar162._8_4_ = auVar94._8_4_ + fStack_758;
      auVar162._12_4_ = auVar94._12_4_ + fStack_754;
      auVar162._16_4_ = auVar94._16_4_ + fStack_750;
      auVar162._20_4_ = auVar94._20_4_ + fStack_74c;
      auVar162._24_4_ = auVar94._24_4_ + fStack_748;
      auVar162._28_4_ = auVar94._28_4_ + fStack_744;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar35._4_4_ = uVar154;
      auVar35._0_4_ = uVar154;
      auVar35._8_4_ = uVar154;
      auVar35._12_4_ = uVar154;
      auVar35._16_4_ = uVar154;
      auVar35._20_4_ = uVar154;
      auVar35._24_4_ = uVar154;
      auVar35._28_4_ = uVar154;
      uVar15 = vcmpps_avx512vl(auVar162,auVar35,2);
      uVar131 = (uint)uVar15 & (uint)abStack_1a0[uVar58 * 0x60];
    } while (uVar131 == 0);
    uVar67 = (&uStack_160)[uVar58 * 0xc];
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar67;
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar95 = vblendmps_avx512vl(auVar195,auVar94);
    bVar54 = (byte)uVar131;
    auVar127._0_4_ =
         (uint)(bVar54 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar94._0_4_;
    bVar64 = (bool)((byte)(uVar131 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * (int)auVar94._4_4_;
    bVar64 = (bool)((byte)(uVar131 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * (int)auVar94._8_4_;
    bVar64 = (bool)((byte)(uVar131 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * (int)auVar94._12_4_;
    bVar64 = (bool)((byte)(uVar131 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar64 * auVar95._16_4_ | (uint)!bVar64 * (int)auVar94._16_4_;
    bVar64 = (bool)((byte)(uVar131 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar64 * auVar95._20_4_ | (uint)!bVar64 * (int)auVar94._20_4_;
    bVar64 = (bool)((byte)(uVar131 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar64 * auVar95._24_4_ | (uint)!bVar64 * (int)auVar94._24_4_;
    auVar127._28_4_ =
         (uVar131 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar131 >> 7,0) * (int)auVar94._28_4_;
    auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar94 = vminps_avx(auVar127,auVar94);
    auVar95 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar95);
    auVar95 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar95);
    uVar15 = vcmpps_avx512vl(auVar127,auVar94,0);
    bVar62 = (byte)uVar15 & bVar54;
    if (bVar62 != 0) {
      uVar131 = (uint)bVar62;
    }
    uVar132 = 0;
    for (; (uVar131 & 1) == 0; uVar131 = uVar131 >> 1 | 0x80000000) {
      uVar132 = uVar132 + 1;
    }
    local_cd4 = aiStack_158[uVar58 * 0x18];
    bVar54 = ~('\x01' << ((byte)uVar132 & 0x1f)) & bVar54;
    abStack_1a0[uVar58 * 0x60] = bVar54;
    if (bVar54 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar154 = (undefined4)uVar67;
    auVar146._4_4_ = uVar154;
    auVar146._0_4_ = uVar154;
    auVar146._8_4_ = uVar154;
    auVar146._12_4_ = uVar154;
    auVar146._16_4_ = uVar154;
    auVar146._20_4_ = uVar154;
    auVar146._24_4_ = uVar154;
    auVar146._28_4_ = uVar154;
    auVar69 = vmovshdup_avx(auVar155);
    auVar69 = vsubps_avx(auVar69,auVar155);
    auVar163._0_4_ = auVar69._0_4_;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar69 = vfmadd132ps_fma(auVar163,auVar146,auVar226._0_32_);
    auVar94 = ZEXT1632(auVar69);
    local_400[0] = (RTCHitN)auVar94[0];
    local_400[1] = (RTCHitN)auVar94[1];
    local_400[2] = (RTCHitN)auVar94[2];
    local_400[3] = (RTCHitN)auVar94[3];
    local_400[4] = (RTCHitN)auVar94[4];
    local_400[5] = (RTCHitN)auVar94[5];
    local_400[6] = (RTCHitN)auVar94[6];
    local_400[7] = (RTCHitN)auVar94[7];
    local_400[8] = (RTCHitN)auVar94[8];
    local_400[9] = (RTCHitN)auVar94[9];
    local_400[10] = (RTCHitN)auVar94[10];
    local_400[0xb] = (RTCHitN)auVar94[0xb];
    local_400[0xc] = (RTCHitN)auVar94[0xc];
    local_400[0xd] = (RTCHitN)auVar94[0xd];
    local_400[0xe] = (RTCHitN)auVar94[0xe];
    local_400[0xf] = (RTCHitN)auVar94[0xf];
    local_400[0x10] = (RTCHitN)auVar94[0x10];
    local_400[0x11] = (RTCHitN)auVar94[0x11];
    local_400[0x12] = (RTCHitN)auVar94[0x12];
    local_400[0x13] = (RTCHitN)auVar94[0x13];
    local_400[0x14] = (RTCHitN)auVar94[0x14];
    local_400[0x15] = (RTCHitN)auVar94[0x15];
    local_400[0x16] = (RTCHitN)auVar94[0x16];
    local_400[0x17] = (RTCHitN)auVar94[0x17];
    local_400[0x18] = (RTCHitN)auVar94[0x18];
    local_400[0x19] = (RTCHitN)auVar94[0x19];
    local_400[0x1a] = (RTCHitN)auVar94[0x1a];
    local_400[0x1b] = (RTCHitN)auVar94[0x1b];
    local_400[0x1c] = (RTCHitN)auVar94[0x1c];
    local_400[0x1d] = (RTCHitN)auVar94[0x1d];
    local_400[0x1e] = (RTCHitN)auVar94[0x1e];
    local_400[0x1f] = (RTCHitN)auVar94[0x1f];
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_400 + (ulong)uVar132 * 4);
    uVar58 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }